

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx::SubdivPatch1IntersectorK<8>,_true>::
     occludedCoherent(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  RayK<8> *pRVar4;
  undefined4 uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCRayQueryContext *pRVar8;
  RTCFilterFunctionN p_Var9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [28];
  undefined1 auVar94 [28];
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  ulong uVar97;
  RayK<8> *pRVar98;
  RayK<8> *pRVar99;
  undefined4 uVar100;
  ulong uVar101;
  long lVar102;
  uint uVar103;
  ulong *puVar104;
  ulong uVar105;
  long lVar106;
  ulong uVar107;
  ulong uVar108;
  long lVar109;
  long lVar110;
  long lVar111;
  long lVar112;
  long lVar113;
  long lVar114;
  bool bVar115;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  float fVar143;
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  float fVar134;
  float fVar135;
  float fVar138;
  float fVar140;
  undefined1 auVar124 [32];
  float fVar132;
  float fVar136;
  float fVar142;
  float fVar144;
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar133;
  float fVar137;
  float fVar139;
  float fVar141;
  undefined1 in_ZMM0 [64];
  float fVar145;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar162;
  float fVar164;
  float fVar168;
  float fVar170;
  float fVar171;
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar166;
  float fVar172;
  undefined1 auVar154 [32];
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar169;
  float fVar173;
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar174;
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  float fVar189;
  float fVar191;
  float fVar195;
  float fVar197;
  float fVar199;
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar175;
  float fVar193;
  undefined1 auVar184 [32];
  float fVar190;
  float fVar192;
  float fVar194;
  undefined1 auVar178 [16];
  float fVar196;
  float fVar198;
  float fVar200;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar224;
  float fVar225;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar226 [32];
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar251;
  float fVar255;
  float fVar256;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar246 [32];
  float fVar262;
  undefined1 auVar247 [32];
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar257;
  float fVar261;
  undefined1 auVar250 [32];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar275 [32];
  float fVar281;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [64];
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  undefined1 auVar288 [32];
  float fVar301;
  float fVar302;
  float fVar306;
  undefined1 auVar305 [64];
  float fVar307;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar308 [64];
  undefined1 auVar315 [64];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar319 [64];
  RTCFilterFunctionNArguments args;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  RayK<8> *local_1930;
  long local_18f8;
  long local_18f0;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float local_18c0;
  float fStack_18bc;
  float fStack_18b8;
  float fStack_18b4;
  float fStack_18b0;
  float fStack_18ac;
  float fStack_18a8;
  undefined1 local_1860 [32];
  undefined1 local_1840 [48];
  undefined1 (*local_1810) [32];
  RayK<8> *local_1808;
  long local_1800;
  long local_17f8;
  RTCFilterFunctionNArguments local_17f0;
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [8];
  float fStack_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float fStack_1728;
  undefined4 uStack_1724;
  undefined1 local_1720 [32];
  ulong local_16f0;
  undefined8 uStack_16e8;
  ulong local_16e0;
  ulong local_16d8;
  AccelData *local_16d0;
  long local_16c8;
  long local_16c0;
  long local_16b8;
  ulong local_16b0;
  RayK<8> *local_16a8;
  ulong local_16a0;
  ulong local_1698;
  ulong local_1690;
  ulong local_1688;
  undefined1 local_1680 [32];
  undefined8 local_1660;
  undefined1 auStack_1658 [8];
  float fStack_1650;
  float fStack_164c;
  float fStack_1648;
  undefined8 local_1640;
  undefined1 auStack_1638 [8];
  float fStack_1630;
  float fStack_162c;
  float fStack_1628;
  undefined1 local_1620 [32];
  long local_1600;
  float fStack_15f8;
  float fStack_15f4;
  float fStack_15f0;
  float fStack_15ec;
  float fStack_15e8;
  undefined4 uStack_15e4;
  undefined1 local_15e0 [32];
  undefined1 local_15c0 [32];
  undefined1 local_15a0 [32];
  undefined1 local_1580 [32];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [48];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  undefined1 local_1490 [16];
  undefined1 local_1480 [8];
  float fStack_1478;
  float fStack_1474;
  undefined1 local_1470 [8];
  float fStack_1468;
  float fStack_1464;
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  undefined1 local_1440 [8];
  float fStack_1438;
  float fStack_1434;
  undefined1 local_1430 [16];
  undefined1 local_1420 [8];
  float fStack_1418;
  float fStack_1414;
  undefined1 local_1410 [16];
  undefined1 local_1400 [8];
  float fStack_13f8;
  float fStack_13f4;
  undefined1 local_13f0 [16];
  undefined1 local_13e0 [8];
  float fStack_13d8;
  float fStack_13d4;
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [8];
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  uint local_12a0;
  uint uStack_129c;
  uint uStack_1298;
  uint uStack_1294;
  uint uStack_1290;
  uint uStack_128c;
  uint uStack_1288;
  uint uStack_1284;
  uint local_1280;
  uint uStack_127c;
  uint uStack_1278;
  uint uStack_1274;
  uint uStack_1270;
  uint uStack_126c;
  uint uStack_1268;
  uint uStack_1264;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  ulong local_fa0 [494];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [24];
  undefined1 auVar245 [24];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar274 [24];
  undefined1 auVar276 [32];
  undefined1 auVar303 [24];
  undefined1 auVar304 [32];
  
  auVar201 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar178 = vpcmpeqd_avx(auVar201,*(undefined1 (*) [16])(valid_i->field_0).field_1.vl);
  auVar216 = vpcmpeqd_avx(auVar201,*(undefined1 (*) [16])((long)&valid_i->field_0 + 0x10));
  auVar178 = vpackssdw_avx(auVar178,auVar216);
  if ((((((((((((((((auVar178 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar178 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar178 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar178 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar178 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar178 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar178 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar178 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar178 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar178 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar178 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar178 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar178 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar178 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar178 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar178[0xf]) {
    return;
  }
  auVar216 = vpacksswb_avx(auVar178,auVar178);
  local_16d0 = This->ptr;
  local_1760 = *(undefined1 (*) [32])ray;
  auVar305 = ZEXT3264(local_1760);
  local_1780 = *(undefined1 (*) [32])(ray + 0x20);
  auVar308 = ZEXT3264(local_1780);
  local_17a0 = *(undefined1 (*) [32])(ray + 0x40);
  auVar315 = ZEXT3264(local_17a0);
  auVar186 = *(undefined1 (*) [32])(ray + 0x80);
  auVar263._8_4_ = 0x7fffffff;
  auVar263._0_8_ = 0x7fffffff7fffffff;
  auVar263._12_4_ = 0x7fffffff;
  auVar263._16_4_ = 0x7fffffff;
  auVar263._20_4_ = 0x7fffffff;
  auVar263._24_4_ = 0x7fffffff;
  auVar263._28_4_ = 0x7fffffff;
  auVar275._8_4_ = 0x219392ef;
  auVar275._0_8_ = 0x219392ef219392ef;
  auVar275._12_4_ = 0x219392ef;
  auVar275._16_4_ = 0x219392ef;
  auVar275._20_4_ = 0x219392ef;
  auVar275._24_4_ = 0x219392ef;
  auVar275._28_4_ = 0x219392ef;
  auVar118 = vandps_avx(auVar263,auVar186);
  auVar130 = vcmpps_avx(auVar118,auVar275,1);
  auVar246._8_4_ = 0x3f800000;
  auVar246._0_8_ = &DAT_3f8000003f800000;
  auVar246._12_4_ = 0x3f800000;
  auVar246._16_4_ = 0x3f800000;
  auVar246._20_4_ = 0x3f800000;
  auVar246._24_4_ = 0x3f800000;
  auVar246._28_4_ = 0x3f800000;
  auVar179 = vdivps_avx(auVar246,auVar186);
  auVar118 = vandps_avx(auVar263,*(undefined1 (*) [32])(ray + 0xa0));
  auVar180 = vdivps_avx(auVar246,*(undefined1 (*) [32])(ray + 0xa0));
  auVar181 = vdivps_avx(auVar246,*(undefined1 (*) [32])(ray + 0xc0));
  auVar246 = vcmpps_avx(auVar118,auVar275,1);
  auVar118 = vandps_avx(auVar263,*(undefined1 (*) [32])(ray + 0xc0));
  auVar264._8_4_ = 0x5d5e0b6b;
  auVar264._0_8_ = 0x5d5e0b6b5d5e0b6b;
  auVar264._12_4_ = 0x5d5e0b6b;
  auVar264._16_4_ = 0x5d5e0b6b;
  auVar264._20_4_ = 0x5d5e0b6b;
  auVar264._24_4_ = 0x5d5e0b6b;
  auVar264._28_4_ = 0x5d5e0b6b;
  local_17c0 = vblendvps_avx(auVar179,auVar264,auVar130);
  auVar319 = ZEXT3264(local_17c0);
  auVar130 = vblendvps_avx(auVar180,auVar264,auVar246);
  auVar118 = vcmpps_avx(auVar118,auVar275,1);
  auVar246 = vblendvps_avx(auVar181,auVar264,auVar118);
  auVar202 = vpmovsxwd_avx(auVar178);
  local_14b0 = vpunpckhwd_avx(auVar178,auVar178);
  auVar178 = auVar178 ^ auVar201;
  auVar201 = vpmovsxwd_avx(auVar178);
  auVar178 = vpunpckhwd_avx(auVar178,auVar178);
  auVar279 = ZEXT3264(CONCAT1616(auVar178,auVar201));
  auVar118._8_4_ = 1;
  auVar118._0_8_ = 0x100000001;
  auVar118._12_4_ = 1;
  auVar118._16_4_ = 1;
  auVar118._20_4_ = 1;
  auVar118._24_4_ = 1;
  auVar118._28_4_ = 1;
  auVar186 = vcmpps_avx(auVar186,ZEXT832(0) << 0x20,1);
  auVar186 = vandps_avx(auVar186,auVar118);
  auVar118 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xa0),ZEXT832(0) << 0x20,1);
  auVar179._8_4_ = 2;
  auVar179._0_8_ = 0x200000002;
  auVar179._12_4_ = 2;
  auVar179._16_4_ = 2;
  auVar179._20_4_ = 2;
  auVar179._24_4_ = 2;
  auVar179._28_4_ = 2;
  auVar118 = vandps_avx(auVar118,auVar179);
  auVar118 = vorps_avx(auVar118,auVar186);
  auVar179 = ZEXT832(0) << 0x20;
  auVar186 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0xc0),auVar179,1);
  auVar180._8_4_ = 4;
  auVar180._0_8_ = 0x400000004;
  auVar180._12_4_ = 4;
  auVar180._16_4_ = 4;
  auVar180._20_4_ = 4;
  auVar180._24_4_ = 4;
  auVar180._28_4_ = 4;
  auVar186 = vandps_avx(auVar186,auVar180);
  local_1240 = ZEXT1632(auVar202);
  auVar181._16_16_ = local_14b0;
  auVar181._0_16_ = auVar202;
  auVar118 = vorps_avx(auVar118,auVar186);
  auVar186 = vcmpps_avx(auVar186,auVar186,0xf);
  local_14e0._0_32_ = vblendvps_avx(auVar186,auVar118,auVar181);
  local_16e0 = (ulong)(byte)(SUB161(auVar216 >> 7,0) & 1 | (SUB161(auVar216 >> 0xf,0) & 1) << 1 |
                             (SUB161(auVar216 >> 0x17,0) & 1) << 2 |
                             (SUB161(auVar216 >> 0x1f,0) & 1) << 3 |
                             (SUB161(auVar216 >> 0x27,0) & 1) << 4 |
                             (SUB161(auVar216 >> 0x2f,0) & 1) << 5 |
                             (SUB161(auVar216 >> 0x37,0) & 1) << 6 | SUB161(auVar216 >> 0x3f,0) << 7
                            );
  local_11e0 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar179);
  pRVar2 = ray + 0x100;
  local_1200 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar179);
  local_1810 = (undefined1 (*) [32])&local_12a0;
  local_1930 = (RayK<8> *)0x0;
  local_1260 = mm_lookupmask_ps._16_8_;
  uStack_1258 = mm_lookupmask_ps._24_8_;
  uStack_1250 = mm_lookupmask_ps._16_8_;
  uStack_1248 = mm_lookupmask_ps._24_8_;
LAB_003f5753:
  lVar112 = 0;
  if (local_16e0 != 0) {
    for (; (local_16e0 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
    }
  }
  uVar100 = *(undefined4 *)(local_14e0 + lVar112 * 4);
  auVar201._4_4_ = uVar100;
  auVar201._0_4_ = uVar100;
  auVar201._8_4_ = uVar100;
  auVar201._12_4_ = uVar100;
  auVar178 = vpcmpeqd_avx(auVar201,local_14e0._0_16_);
  auVar201 = vpcmpeqd_avx(auVar201,local_14e0._16_16_);
  auVar243 = vpackssdw_avx(auVar178,auVar201);
  auVar178 = vpmovsxwd_avx(auVar243);
  auVar201 = vpunpckhwd_avx(auVar243,auVar243);
  local_1620._16_16_ = auVar201;
  local_1620._0_16_ = auVar178;
  auVar288._8_4_ = 0x7f800000;
  auVar288._0_8_ = 0x7f8000007f800000;
  auVar288._12_4_ = 0x7f800000;
  auVar288._16_4_ = 0x7f800000;
  auVar288._20_4_ = 0x7f800000;
  auVar288._24_4_ = 0x7f800000;
  auVar288._28_4_ = 0x7f800000;
  local_13a0 = vblendvps_avx(auVar288,local_11e0,local_1620);
  auVar186 = vblendvps_avx(auVar288,auVar319._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar118 = vminps_avx(auVar186,auVar118);
  auVar186 = vblendvps_avx(auVar288,auVar130,local_1620);
  auVar178 = vminps_avx(auVar118._0_16_,auVar118._16_16_);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar201 = vminps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar201 = vunpcklps_avx(auVar178,auVar201);
  auVar186 = vblendvps_avx(auVar288,auVar246,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar178 = vminps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar203 = vinsertps_avx(auVar201,auVar178,0x28);
  auVar151._8_4_ = 0xff800000;
  auVar151._0_8_ = 0xff800000ff800000;
  auVar151._12_4_ = 0xff800000;
  auVar151._16_4_ = 0xff800000;
  auVar151._20_4_ = 0xff800000;
  auVar151._24_4_ = 0xff800000;
  auVar151._28_4_ = 0xff800000;
  auVar186 = vblendvps_avx(auVar151,auVar319._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar178 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar186 = vblendvps_avx(auVar151,auVar130,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar201 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar201 = vunpcklps_avx(auVar178,auVar201);
  auVar186 = vblendvps_avx(auVar151,auVar246,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar178 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar216 = vinsertps_avx(auVar201,auVar178,0x28);
  auVar202 = vcmpps_avx(auVar203,_DAT_01feba10,5);
  auVar178 = vblendvps_avx(auVar216,auVar203,auVar202);
  auVar201 = vmovshdup_avx(auVar178);
  local_16d8 = (ulong)(auVar201._0_4_ < 0.0) << 4 | 0x20;
  auVar201 = vshufpd_avx(auVar178,auVar178,1);
  local_16f0 = (ulong)(auVar201._0_4_ < 0.0) << 4 | 0x40;
  local_1688 = local_16d8 ^ 0x10;
  auVar186 = vblendvps_avx(auVar151,auVar305._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar201 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar186 = vblendvps_avx(auVar151,auVar308._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar214 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar186 = vblendvps_avx(auVar151,auVar315._0_32_,local_1620);
  auVar214 = vunpcklps_avx(auVar201,auVar214);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar201 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar214 = vinsertps_avx(auVar214,auVar201,0x28);
  auVar186 = vblendvps_avx(auVar288,auVar305._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar201 = vminps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar186 = vblendvps_avx(auVar288,auVar308._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar242 = vminps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar242 = vunpcklps_avx(auVar201,auVar242);
  auVar186 = vblendvps_avx(auVar288,auVar315._0_32_,local_1620);
  auVar118 = vshufps_avx(auVar186,auVar186,0xb1);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vminps_avx(auVar186,auVar118);
  auVar201 = vminps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar242 = vinsertps_avx(auVar242,auVar201,0x28);
  auVar201 = vblendvps_avx(auVar242,auVar214,auVar202);
  local_1500 = vblendvps_avx(auVar151,local_1200,local_1620);
  auVar186 = vshufps_avx(local_1500,local_1500,0xb1);
  auVar186 = vmaxps_avx(local_1500,auVar186);
  auVar118 = vshufpd_avx(auVar186,auVar186,5);
  auVar186 = vmaxps_avx(auVar186,auVar118);
  auVar118 = vshufps_avx(local_13a0,local_13a0,0xb1);
  auVar118 = vminps_avx(local_13a0,auVar118);
  auVar179 = vshufpd_avx(auVar118,auVar118,5);
  auVar118 = vminps_avx(auVar118,auVar179);
  auVar243 = vpacksswb_avx(auVar243,auVar243);
  uVar101 = (ulong)(byte)(SUB161(auVar243 >> 7,0) & 1 | (SUB161(auVar243 >> 0xf,0) & 1) << 1 |
                          (SUB161(auVar243 >> 0x17,0) & 1) << 2 |
                          (SUB161(auVar243 >> 0x1f,0) & 1) << 3 |
                          (SUB161(auVar243 >> 0x27,0) & 1) << 4 |
                          (SUB161(auVar243 >> 0x2f,0) & 1) << 5 |
                          (SUB161(auVar243 >> 0x37,0) & 1) << 6 | SUB161(auVar243 >> 0x3f,0) << 7);
  local_fa0[0] = *(ulong *)&local_16d0[1].bounds.bounds0.lower.field_0;
  local_fa0[1] = uVar101;
  local_16e0 = ~uVar101 & local_16e0;
  auVar150 = vminps_avx(auVar118._0_16_,auVar118._16_16_);
  auVar279 = ZEXT3264(auVar279._0_32_);
  auVar243 = vmaxps_avx(auVar186._0_16_,auVar186._16_16_);
  auVar216 = vblendvps_avx(auVar203,auVar216,auVar202);
  auVar202 = vblendvps_avx(auVar214,auVar242,auVar202);
  local_1690 = (ulong)(auVar178._0_4_ < 0.0) << 4;
  local_1698 = local_1690 ^ 0x10;
  uStack_16e8 = auVar203._8_8_;
  local_16a0 = local_16f0 ^ 0x10;
  local_13d0 = vshufps_avx(auVar201,auVar201,0);
  _local_13e0 = vshufps_avx(auVar178,auVar178,0);
  local_13f0 = vshufps_avx(auVar201,auVar201,0x55);
  _local_1400 = vshufps_avx(auVar178,auVar178,0x55);
  local_1410 = vshufps_avx(auVar201,auVar201,0xaa);
  _local_1420 = vshufps_avx(auVar178,auVar178,0xaa);
  local_1430 = vshufps_avx(auVar202,auVar202,0);
  _local_1440 = vshufps_avx(auVar216,auVar216,0);
  local_1450 = vshufps_avx(auVar202,auVar202,0x55);
  local_1460 = vshufps_avx(auVar202,auVar202,0xaa);
  _local_1470 = vshufps_avx(auVar216,auVar216,0x55);
  _local_1480 = vshufps_avx(auVar216,auVar216,0xaa);
  local_1490 = vshufps_avx(auVar150,auVar150,0);
  local_14a0 = vshufps_avx(auVar243,auVar243,0);
  puVar104 = local_fa0 + 2;
LAB_003f5bb5:
  local_1220 = auVar279._0_32_;
  if (puVar104 != local_fa0) {
    puVar1 = puVar104 + -2;
    uVar100 = vmovmskps_avx(local_1220);
    uVar101 = ~CONCAT44((int)(uVar101 >> 0x20),uVar100) & puVar104[-1];
    puVar104 = puVar1;
    if (uVar101 != 0) {
      uVar97 = *puVar1;
      do {
        if ((uVar97 & 8) != 0) {
          if (uVar101 != 0) {
            if (((uint)uVar97 & 0xf) != 8) {
              pRVar99 = (RayK<8> *)(uVar97 & 0xfffffffffffffff0);
              uVar101 = *(ulong *)(pRVar99 + (ulong)*(uint *)(pRVar99 + 0x2c) + 0x30);
              auVar129._8_8_ = uStack_1258;
              auVar129._0_8_ = local_1260;
              auVar129._16_8_ = uStack_1250;
              auVar129._24_8_ = uStack_1248;
              local_1930 = pRVar99;
              goto LAB_003f73ff;
            }
            local_1860._0_8_ = auVar279._0_8_ ^ 0xffffffffffffffff;
            local_1860._8_4_ = auVar279._8_4_ ^ 0xffffffff;
            local_1860._12_4_ = auVar279._12_4_ ^ 0xffffffff;
            local_1860._16_4_ = auVar279._16_4_ ^ 0xffffffff;
            local_1860._20_4_ = auVar279._20_4_ ^ 0xffffffff;
            local_1860._24_4_ = auVar279._24_4_ ^ 0xffffffff;
            local_1860._28_4_ = auVar279._28_4_ ^ 0xffffffff;
            uVar101 = (ulong)*(uint *)(local_1930 + 0x14);
            local_16b0 = (ulong)*(uint *)(local_1930 + 0xc);
            iVar6 = *(int *)(local_1930 + 0x10);
            lVar112 = (ulong)*(uint *)(local_1930 + 0x24) + (uVar97 >> 4) * 4;
            lVar113 = uVar101 * 0xc + lVar112 + 0x30;
            local_16c8 = local_16b0 * 4;
            local_17f8 = lVar112 + 0x30 + uVar101 * 8;
            local_1800 = lVar112 + 0x30 + uVar101 * 4;
            local_16b8 = (ulong)*(uint *)(local_1930 + 0x24) + 0x30 + (uVar97 >> 4) * 4;
            local_18f0 = lVar112 + 0x2c + uVar101 * 0xc + local_16b0 * 4;
            lVar111 = local_17f8 + local_16b0 * 4;
            lVar110 = lVar112 + local_16b0 * 4 + 0x30;
            lVar112 = lVar110 + uVar101 * 4;
            local_1808 = (RayK<8> *)0x0;
            goto LAB_003f5ed0;
          }
          break;
        }
        auVar178 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_1690),local_13d0);
        auVar116._0_4_ = auVar178._0_4_ * (float)local_13e0._0_4_;
        auVar116._4_4_ = auVar178._4_4_ * (float)local_13e0._4_4_;
        auVar116._8_4_ = auVar178._8_4_ * fStack_13d8;
        auVar116._12_4_ = auVar178._12_4_ * fStack_13d4;
        auVar178 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_16d8),local_13f0);
        auVar146._0_4_ = auVar178._0_4_ * (float)local_1400._0_4_;
        auVar146._4_4_ = auVar178._4_4_ * (float)local_1400._4_4_;
        auVar146._8_4_ = auVar178._8_4_ * fStack_13f8;
        auVar146._12_4_ = auVar178._12_4_ * fStack_13f4;
        auVar178 = vmaxps_avx(auVar116,auVar146);
        auVar201 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_16f0),local_1410);
        auVar147._0_4_ = auVar201._0_4_ * (float)local_1420._0_4_;
        auVar147._4_4_ = auVar201._4_4_ * (float)local_1420._4_4_;
        auVar147._8_4_ = auVar201._8_4_ * fStack_1418;
        auVar147._12_4_ = auVar201._12_4_ * fStack_1414;
        auVar201 = vmaxps_avx(auVar147,local_1490);
        auVar178 = vmaxps_avx(auVar178,auVar201);
        auVar201 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_1698),local_1430);
        auVar148._0_4_ = auVar201._0_4_ * (float)local_1440._0_4_;
        auVar148._4_4_ = auVar201._4_4_ * (float)local_1440._4_4_;
        auVar148._8_4_ = auVar201._8_4_ * fStack_1438;
        auVar148._12_4_ = auVar201._12_4_ * fStack_1434;
        auVar201 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_1688),local_1450);
        auVar176._0_4_ = auVar201._0_4_ * (float)local_1470._0_4_;
        auVar176._4_4_ = auVar201._4_4_ * (float)local_1470._4_4_;
        auVar176._8_4_ = auVar201._8_4_ * fStack_1468;
        auVar176._12_4_ = auVar201._12_4_ * fStack_1464;
        auVar201 = vminps_avx(auVar148,auVar176);
        auVar216 = vsubps_avx(*(undefined1 (*) [16])(uVar97 + 0x20 + local_16a0),local_1460);
        auVar177._0_4_ = auVar216._0_4_ * (float)local_1480._0_4_;
        auVar177._4_4_ = auVar216._4_4_ * (float)local_1480._4_4_;
        auVar177._8_4_ = auVar216._8_4_ * fStack_1478;
        auVar177._12_4_ = auVar216._12_4_ * fStack_1474;
        auVar216 = vminps_avx(auVar177,local_14a0);
        auVar201 = vminps_avx(auVar201,auVar216);
        auVar117._0_4_ = auVar178._0_4_ * 0.99999976;
        auVar117._4_4_ = auVar178._4_4_ * 0.99999976;
        auVar117._8_4_ = auVar178._8_4_ * 0.99999976;
        auVar117._12_4_ = auVar178._12_4_ * 0.99999976;
        auVar149._0_4_ = auVar201._0_4_ * 1.0000002;
        auVar149._4_4_ = auVar201._4_4_ * 1.0000002;
        auVar149._8_4_ = auVar201._8_4_ * 1.0000002;
        auVar149._12_4_ = auVar201._12_4_ * 1.0000002;
        auVar178 = vcmpps_avx(auVar117,auVar149,2);
        uVar103 = vmovmskps_avx(auVar178);
        if (uVar103 == 0) {
          bVar115 = false;
        }
        else {
          uVar105 = (ulong)(uVar103 & 0xff);
          uVar101 = 0;
          uVar107 = 8;
          do {
            lVar112 = 0;
            if (uVar105 != 0) {
              for (; (uVar105 >> lVar112 & 1) == 0; lVar112 = lVar112 + 1) {
              }
            }
            uVar100 = *(undefined4 *)(uVar97 + 0x20 + lVar112 * 4);
            auVar119._4_4_ = uVar100;
            auVar119._0_4_ = uVar100;
            auVar119._8_4_ = uVar100;
            auVar119._12_4_ = uVar100;
            auVar119._16_4_ = uVar100;
            auVar119._20_4_ = uVar100;
            auVar119._24_4_ = uVar100;
            auVar119._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar119,auVar305._0_32_);
            auVar19._4_4_ = auVar319._4_4_ * auVar186._4_4_;
            auVar19._0_4_ = auVar319._0_4_ * auVar186._0_4_;
            auVar19._8_4_ = auVar319._8_4_ * auVar186._8_4_;
            auVar19._12_4_ = auVar319._12_4_ * auVar186._12_4_;
            auVar19._16_4_ = auVar319._16_4_ * auVar186._16_4_;
            auVar19._20_4_ = auVar319._20_4_ * auVar186._20_4_;
            auVar19._24_4_ = auVar319._24_4_ * auVar186._24_4_;
            auVar19._28_4_ = auVar186._28_4_;
            uVar100 = *(undefined4 *)(uVar97 + 0x40 + lVar112 * 4);
            auVar152._4_4_ = uVar100;
            auVar152._0_4_ = uVar100;
            auVar152._8_4_ = uVar100;
            auVar152._12_4_ = uVar100;
            auVar152._16_4_ = uVar100;
            auVar152._20_4_ = uVar100;
            auVar152._24_4_ = uVar100;
            auVar152._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar152,auVar308._0_32_);
            auVar20._4_4_ = auVar130._4_4_ * auVar186._4_4_;
            auVar20._0_4_ = auVar130._0_4_ * auVar186._0_4_;
            auVar20._8_4_ = auVar130._8_4_ * auVar186._8_4_;
            auVar20._12_4_ = auVar130._12_4_ * auVar186._12_4_;
            auVar20._16_4_ = auVar130._16_4_ * auVar186._16_4_;
            auVar20._20_4_ = auVar130._20_4_ * auVar186._20_4_;
            auVar20._24_4_ = auVar130._24_4_ * auVar186._24_4_;
            auVar20._28_4_ = auVar186._28_4_;
            uVar100 = *(undefined4 *)(uVar97 + 0x60 + lVar112 * 4);
            auVar182._4_4_ = uVar100;
            auVar182._0_4_ = uVar100;
            auVar182._8_4_ = uVar100;
            auVar182._12_4_ = uVar100;
            auVar182._16_4_ = uVar100;
            auVar182._20_4_ = uVar100;
            auVar182._24_4_ = uVar100;
            auVar182._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar182,auVar315._0_32_);
            auVar21._4_4_ = auVar246._4_4_ * auVar186._4_4_;
            auVar21._0_4_ = auVar246._0_4_ * auVar186._0_4_;
            auVar21._8_4_ = auVar246._8_4_ * auVar186._8_4_;
            auVar21._12_4_ = auVar246._12_4_ * auVar186._12_4_;
            auVar21._16_4_ = auVar246._16_4_ * auVar186._16_4_;
            auVar21._20_4_ = auVar246._20_4_ * auVar186._20_4_;
            auVar21._24_4_ = auVar246._24_4_ * auVar186._24_4_;
            auVar21._28_4_ = auVar186._28_4_;
            uVar100 = *(undefined4 *)(uVar97 + 0x30 + lVar112 * 4);
            auVar205._4_4_ = uVar100;
            auVar205._0_4_ = uVar100;
            auVar205._8_4_ = uVar100;
            auVar205._12_4_ = uVar100;
            auVar205._16_4_ = uVar100;
            auVar205._20_4_ = uVar100;
            auVar205._24_4_ = uVar100;
            auVar205._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar205,auVar305._0_32_);
            auVar22._4_4_ = auVar319._4_4_ * auVar186._4_4_;
            auVar22._0_4_ = auVar319._0_4_ * auVar186._0_4_;
            auVar22._8_4_ = auVar319._8_4_ * auVar186._8_4_;
            auVar22._12_4_ = auVar319._12_4_ * auVar186._12_4_;
            auVar22._16_4_ = auVar319._16_4_ * auVar186._16_4_;
            auVar22._20_4_ = auVar319._20_4_ * auVar186._20_4_;
            auVar22._24_4_ = auVar319._24_4_ * auVar186._24_4_;
            auVar22._28_4_ = auVar186._28_4_;
            uVar100 = *(undefined4 *)(uVar97 + 0x50 + lVar112 * 4);
            auVar217._4_4_ = uVar100;
            auVar217._0_4_ = uVar100;
            auVar217._8_4_ = uVar100;
            auVar217._12_4_ = uVar100;
            auVar217._16_4_ = uVar100;
            auVar217._20_4_ = uVar100;
            auVar217._24_4_ = uVar100;
            auVar217._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar217,auVar308._0_32_);
            auVar23._4_4_ = auVar130._4_4_ * auVar186._4_4_;
            auVar23._0_4_ = auVar130._0_4_ * auVar186._0_4_;
            auVar23._8_4_ = auVar130._8_4_ * auVar186._8_4_;
            auVar23._12_4_ = auVar130._12_4_ * auVar186._12_4_;
            auVar23._16_4_ = auVar130._16_4_ * auVar186._16_4_;
            auVar23._20_4_ = auVar130._20_4_ * auVar186._20_4_;
            auVar23._24_4_ = auVar130._24_4_ * auVar186._24_4_;
            auVar23._28_4_ = auVar186._28_4_;
            uVar100 = *(undefined4 *)(uVar97 + 0x70 + lVar112 * 4);
            auVar220._4_4_ = uVar100;
            auVar220._0_4_ = uVar100;
            auVar220._8_4_ = uVar100;
            auVar220._12_4_ = uVar100;
            auVar220._16_4_ = uVar100;
            auVar220._20_4_ = uVar100;
            auVar220._24_4_ = uVar100;
            auVar220._28_4_ = uVar100;
            auVar186 = vsubps_avx(auVar220,auVar315._0_32_);
            auVar24._4_4_ = auVar246._4_4_ * auVar186._4_4_;
            auVar24._0_4_ = auVar246._0_4_ * auVar186._0_4_;
            auVar24._8_4_ = auVar246._8_4_ * auVar186._8_4_;
            auVar24._12_4_ = auVar246._12_4_ * auVar186._12_4_;
            auVar24._16_4_ = auVar246._16_4_ * auVar186._16_4_;
            auVar24._20_4_ = auVar246._20_4_ * auVar186._20_4_;
            auVar24._24_4_ = auVar246._24_4_ * auVar186._24_4_;
            auVar24._28_4_ = auVar186._28_4_;
            auVar186 = vminps_avx(auVar19,auVar22);
            auVar118 = vminps_avx(auVar20,auVar23);
            auVar186 = vmaxps_avx(auVar186,auVar118);
            auVar118 = vminps_avx(auVar21,auVar24);
            auVar186 = vmaxps_avx(auVar186,auVar118);
            auVar118 = vmaxps_avx(auVar19,auVar22);
            auVar179 = vmaxps_avx(auVar20,auVar23);
            auVar179 = vminps_avx(auVar118,auVar179);
            auVar118 = vmaxps_avx(auVar21,auVar24);
            auVar179 = vminps_avx(auVar179,auVar118);
            auVar25._4_4_ = auVar186._4_4_ * 0.99999964;
            auVar25._0_4_ = auVar186._0_4_ * 0.99999964;
            auVar25._8_4_ = auVar186._8_4_ * 0.99999964;
            auVar25._12_4_ = auVar186._12_4_ * 0.99999964;
            auVar25._16_4_ = auVar186._16_4_ * 0.99999964;
            auVar25._20_4_ = auVar186._20_4_ * 0.99999964;
            auVar25._24_4_ = auVar186._24_4_ * 0.99999964;
            auVar25._28_4_ = auVar118._28_4_;
            auVar26._4_4_ = auVar179._4_4_ * 1.0000004;
            auVar26._0_4_ = auVar179._0_4_ * 1.0000004;
            auVar26._8_4_ = auVar179._8_4_ * 1.0000004;
            auVar26._12_4_ = auVar179._12_4_ * 1.0000004;
            auVar26._16_4_ = auVar179._16_4_ * 1.0000004;
            auVar26._20_4_ = auVar179._20_4_ * 1.0000004;
            auVar26._24_4_ = auVar179._24_4_ * 1.0000004;
            auVar26._28_4_ = auVar179._28_4_;
            auVar186 = vmaxps_avx(auVar25,local_13a0);
            auVar118 = vminps_avx(auVar26,local_1500);
            auVar186 = vcmpps_avx(auVar186,auVar118,2);
            uVar108 = uVar107;
            if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar186 >> 0x7f,0) != '\0') ||
                  (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar186 >> 0xbf,0) != '\0') ||
                (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar186[0x1f] < '\0') {
              uVar108 = *(ulong *)(uVar97 + lVar112 * 8);
              if (uVar107 != 8) {
                *puVar104 = uVar107;
                puVar104[1] = uVar101;
                puVar104 = puVar104 + 2;
              }
              uVar103 = vmovmskps_avx(auVar186);
              uVar101 = (ulong)uVar103;
            }
            uVar105 = uVar105 & uVar105 - 1;
            uVar107 = uVar108;
          } while (uVar105 != 0);
          bVar115 = uVar108 != 8;
          uVar97 = uVar108;
        }
      } while (bVar115);
    }
    bVar115 = false;
    goto LAB_003f7451;
  }
  goto LAB_003f748e;
  while( true ) {
    pRVar99 = local_1808 + 1;
    lVar113 = lVar113 + local_16c8;
    local_17f8 = local_17f8 + local_16c8;
    local_1800 = local_1800 + local_16c8;
    local_16b8 = local_16b8 + local_16c8;
    local_18f0 = local_16c0 + local_16c8;
    lVar111 = lVar111 + local_16c8;
    lVar112 = lVar112 + local_16c8;
    lVar110 = lVar110 + local_16c8;
    bVar115 = local_1808 != (RayK<8> *)0x0;
    local_1808 = pRVar99;
    if (bVar115) break;
LAB_003f5ed0:
    pRVar4 = local_1930 + local_16b8;
    pRVar99 = (RayK<8> *)0x0;
    lVar102 = lVar111;
    lVar106 = local_1800;
    lVar109 = lVar112;
    local_1600 = lVar110;
    lVar114 = local_17f8;
    local_18f8 = lVar113;
    local_16c0 = local_18f0;
    while( true ) {
      uVar100 = *(undefined4 *)(pRVar4 + -4 + (long)pRVar99);
      auVar120._4_4_ = uVar100;
      auVar120._0_4_ = uVar100;
      auVar120._8_4_ = uVar100;
      auVar120._12_4_ = uVar100;
      auVar120._16_4_ = uVar100;
      auVar120._20_4_ = uVar100;
      auVar120._24_4_ = uVar100;
      auVar120._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(local_1930 + lVar106 + -4);
      auVar153._4_4_ = uVar100;
      auVar153._0_4_ = uVar100;
      auVar153._8_4_ = uVar100;
      auVar153._12_4_ = uVar100;
      auVar153._16_4_ = uVar100;
      auVar153._20_4_ = uVar100;
      auVar153._24_4_ = uVar100;
      auVar153._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(local_1930 + lVar114 + -4);
      auVar183._4_4_ = uVar100;
      auVar183._0_4_ = uVar100;
      auVar183._8_4_ = uVar100;
      auVar183._12_4_ = uVar100;
      auVar183._16_4_ = uVar100;
      auVar183._20_4_ = uVar100;
      auVar183._24_4_ = uVar100;
      auVar183._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(local_1930 + local_1600 + -4);
      local_15a0._4_4_ = uVar100;
      local_15a0._0_4_ = uVar100;
      local_15a0._8_4_ = uVar100;
      local_15a0._12_4_ = uVar100;
      local_15a0._16_4_ = uVar100;
      local_15a0._20_4_ = uVar100;
      local_15a0._24_4_ = uVar100;
      local_15a0._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(local_1930 + lVar109 + -4);
      local_15c0._4_4_ = uVar100;
      local_15c0._0_4_ = uVar100;
      local_15c0._8_4_ = uVar100;
      local_15c0._12_4_ = uVar100;
      local_15c0._16_4_ = uVar100;
      local_15c0._20_4_ = uVar100;
      local_15c0._24_4_ = uVar100;
      local_15c0._28_4_ = uVar100;
      uVar100 = *(undefined4 *)(local_1930 + lVar102 + -4);
      local_15e0._4_4_ = uVar100;
      local_15e0._0_4_ = uVar100;
      local_15e0._8_4_ = uVar100;
      local_15e0._12_4_ = uVar100;
      local_15e0._16_4_ = uVar100;
      local_15e0._20_4_ = uVar100;
      local_15e0._24_4_ = uVar100;
      local_15e0._28_4_ = uVar100;
      auVar186 = *(undefined1 (*) [32])(ray + 0x20);
      auVar118 = *(undefined1 (*) [32])(ray + 0x40);
      auVar180 = vsubps_avx(auVar153,auVar186);
      auVar181 = vsubps_avx(auVar183,auVar118);
      auVar263 = vsubps_avx(local_15c0,auVar186);
      auVar264 = vsubps_avx(local_15e0,auVar118);
      auVar275 = vsubps_avx(auVar263,auVar180);
      auVar151 = vsubps_avx(auVar264,auVar181);
      fVar310 = auVar180._0_4_;
      fVar224 = fVar310 + auVar263._0_4_;
      fVar312 = auVar180._4_4_;
      fVar227 = fVar312 + auVar263._4_4_;
      fVar314 = auVar180._8_4_;
      fVar229 = fVar314 + auVar263._8_4_;
      fVar316 = auVar180._12_4_;
      fVar231 = fVar316 + auVar263._12_4_;
      fVar318 = auVar180._16_4_;
      fVar233 = fVar318 + auVar263._16_4_;
      fVar320 = auVar180._20_4_;
      fVar235 = fVar320 + auVar263._20_4_;
      fVar322 = auVar180._24_4_;
      fVar237 = fVar322 + auVar263._24_4_;
      fVar172 = auVar263._28_4_;
      fVar145 = auVar180._28_4_;
      fVar173 = auVar181._0_4_;
      fVar239 = fVar173 + auVar264._0_4_;
      fVar190 = auVar181._4_4_;
      fVar251 = fVar190 + auVar264._4_4_;
      fVar194 = auVar181._8_4_;
      fVar255 = fVar194 + auVar264._8_4_;
      fVar198 = auVar181._12_4_;
      fVar256 = fVar198 + auVar264._12_4_;
      fVar225 = auVar181._16_4_;
      fVar258 = fVar225 + auVar264._16_4_;
      fVar230 = auVar181._20_4_;
      fVar259 = fVar230 + auVar264._20_4_;
      fVar234 = auVar181._24_4_;
      fVar260 = fVar234 + auVar264._24_4_;
      fVar262 = auVar181._28_4_ + auVar264._28_4_;
      fVar238 = auVar151._0_4_;
      fVar241 = auVar151._4_4_;
      auVar16._4_4_ = fVar241 * fVar227;
      auVar16._0_4_ = fVar238 * fVar224;
      fVar254 = auVar151._8_4_;
      auVar16._8_4_ = fVar254 * fVar229;
      fVar290 = auVar151._12_4_;
      auVar16._12_4_ = fVar290 * fVar231;
      fVar294 = auVar151._16_4_;
      auVar16._16_4_ = fVar294 * fVar233;
      fVar298 = auVar151._20_4_;
      auVar16._20_4_ = fVar298 * fVar235;
      fVar307 = auVar151._24_4_;
      auVar16._24_4_ = fVar307 * fVar237;
      auVar16._28_4_ = fVar172;
      fVar131 = auVar275._0_4_;
      fVar137 = auVar275._4_4_;
      auVar92._4_4_ = fVar251 * fVar137;
      auVar92._0_4_ = fVar239 * fVar131;
      fVar143 = auVar275._8_4_;
      auVar92._8_4_ = fVar255 * fVar143;
      fVar136 = auVar275._12_4_;
      auVar92._12_4_ = fVar256 * fVar136;
      fVar142 = auVar275._16_4_;
      auVar92._16_4_ = fVar258 * fVar142;
      fVar10 = auVar275._20_4_;
      auVar92._20_4_ = fVar259 * fVar10;
      fVar257 = auVar275._24_4_;
      auVar92._24_4_ = fVar260 * fVar257;
      auVar92._28_4_ = auVar246._28_4_;
      auVar288 = vsubps_avx(auVar92,auVar16);
      auVar179 = *(undefined1 (*) [32])ray;
      auVar16 = vsubps_avx(auVar120,auVar179);
      auVar17 = vsubps_avx(local_15a0,auVar179);
      local_1520 = vsubps_avx(auVar17,auVar16);
      fVar133 = local_1520._0_4_;
      fVar139 = local_1520._4_4_;
      auVar18._4_4_ = fVar251 * fVar139;
      auVar18._0_4_ = fVar239 * fVar133;
      fVar132 = local_1520._8_4_;
      auVar18._8_4_ = fVar255 * fVar132;
      fVar252 = local_1520._12_4_;
      auVar18._12_4_ = fVar256 * fVar252;
      fVar144 = local_1520._16_4_;
      auVar18._16_4_ = fVar258 * fVar144;
      fVar11 = local_1520._20_4_;
      auVar18._20_4_ = fVar259 * fVar11;
      fVar13 = local_1520._24_4_;
      auVar18._24_4_ = fVar260 * fVar13;
      auVar18._28_4_ = fVar262;
      fVar239 = auVar16._0_4_;
      fVar271 = auVar17._0_4_ + fVar239;
      fVar251 = auVar16._4_4_;
      fVar280 = auVar17._4_4_ + fVar251;
      fVar255 = auVar16._8_4_;
      fVar282 = auVar17._8_4_ + fVar255;
      fVar256 = auVar16._12_4_;
      fVar283 = auVar17._12_4_ + fVar256;
      fVar258 = auVar16._16_4_;
      fVar284 = auVar17._16_4_ + fVar258;
      fVar259 = auVar16._20_4_;
      fVar285 = auVar17._20_4_ + fVar259;
      fVar260 = auVar16._24_4_;
      fVar286 = auVar17._24_4_ + fVar260;
      auVar27._4_4_ = fVar280 * fVar241;
      auVar27._0_4_ = fVar271 * fVar238;
      auVar27._8_4_ = fVar282 * fVar254;
      auVar27._12_4_ = fVar283 * fVar290;
      auVar27._16_4_ = fVar284 * fVar294;
      auVar27._20_4_ = fVar285 * fVar298;
      auVar27._24_4_ = fVar286 * fVar307;
      auVar27._28_4_ = auVar151._28_4_;
      auVar151 = vsubps_avx(auVar27,auVar18);
      auVar28._4_4_ = fVar280 * fVar137;
      auVar28._0_4_ = fVar271 * fVar131;
      auVar28._8_4_ = fVar282 * fVar143;
      auVar28._12_4_ = fVar283 * fVar136;
      auVar28._16_4_ = fVar284 * fVar142;
      auVar28._20_4_ = fVar285 * fVar10;
      auVar28._24_4_ = fVar286 * fVar257;
      auVar28._28_4_ = fVar262;
      auVar29._4_4_ = fVar139 * fVar227;
      auVar29._0_4_ = fVar133 * fVar224;
      auVar29._8_4_ = fVar132 * fVar229;
      auVar29._12_4_ = fVar252 * fVar231;
      auVar29._16_4_ = fVar144 * fVar233;
      auVar29._20_4_ = fVar11 * fVar235;
      auVar29._24_4_ = fVar13 * fVar237;
      auVar29._28_4_ = fVar145 + fVar172;
      auVar18 = vsubps_avx(auVar29,auVar28);
      pRVar98 = ray + 0xc0;
      fVar280 = *(float *)pRVar98;
      fVar282 = *(float *)(ray + 0xc4);
      fVar283 = *(float *)(ray + 200);
      fVar284 = *(float *)(ray + 0xcc);
      fVar285 = *(float *)(ray + 0xd0);
      fVar286 = *(float *)(ray + 0xd4);
      fVar12 = *(float *)(ray + 0xd8);
      auVar93 = *(undefined1 (*) [28])pRVar98;
      fVar266 = *(float *)(ray + 0xa0);
      fVar261 = *(float *)(ray + 0xa4);
      fStack_15f8 = *(float *)(ray + 0xa8);
      fStack_15f4 = *(float *)(ray + 0xac);
      fStack_15f0 = *(float *)(ray + 0xb0);
      fStack_15ec = *(float *)(ray + 0xb4);
      fStack_15e8 = *(float *)(ray + 0xb8);
      uStack_15e4 = *(undefined4 *)(ray + 0xbc);
      pRVar3 = ray + 0x80;
      fVar14 = *(float *)pRVar3;
      fVar15 = *(float *)(ray + 0x84);
      fVar267 = *(float *)(ray + 0x88);
      fVar268 = *(float *)(ray + 0x8c);
      fVar269 = *(float *)(ray + 0x90);
      fVar270 = *(float *)(ray + 0x94);
      fVar273 = *(float *)(ray + 0x98);
      auVar94 = *(undefined1 (*) [28])pRVar3;
      fVar302 = auVar288._0_4_ * fVar14 + auVar18._0_4_ * fVar280 + auVar151._0_4_ * fVar266;
      fVar306 = auVar288._4_4_ * fVar15 + auVar18._4_4_ * fVar282 + auVar151._4_4_ * fVar261;
      auVar216._0_8_ = CONCAT44(fVar306,fVar302);
      auVar216._8_4_ =
           auVar288._8_4_ * fVar267 + auVar18._8_4_ * fVar283 + auVar151._8_4_ * fStack_15f8;
      auVar216._12_4_ =
           auVar288._12_4_ * fVar268 + auVar18._12_4_ * fVar284 + auVar151._12_4_ * fStack_15f4;
      auVar303._16_4_ =
           auVar288._16_4_ * fVar269 + auVar18._16_4_ * fVar285 + auVar151._16_4_ * fStack_15f0;
      auVar303._0_16_ = auVar216;
      auVar303._20_4_ =
           auVar288._20_4_ * fVar270 + auVar18._20_4_ * fVar286 + auVar151._20_4_ * fStack_15ec;
      auVar304._24_4_ =
           auVar288._24_4_ * fVar273 + auVar18._24_4_ * fVar12 + auVar151._24_4_ * fStack_15e8;
      auVar304._0_24_ = auVar303;
      auVar304._28_4_ = auVar288._28_4_ + auVar17._28_4_ + auVar16._28_4_ + auVar151._28_4_;
      uVar100 = *(undefined4 *)(local_1930 + lVar106);
      local_fc0._4_4_ = uVar100;
      local_fc0._0_4_ = uVar100;
      local_fc0._8_4_ = uVar100;
      local_fc0._12_4_ = uVar100;
      local_fc0._16_4_ = uVar100;
      local_fc0._20_4_ = uVar100;
      local_fc0._24_4_ = uVar100;
      local_fc0._28_4_ = uVar100;
      auVar186 = vsubps_avx(local_fc0,auVar186);
      uVar100 = *(undefined4 *)(local_1930 + lVar114);
      local_fe0._4_4_ = uVar100;
      local_fe0._0_4_ = uVar100;
      local_fe0._8_4_ = uVar100;
      local_fe0._12_4_ = uVar100;
      local_fe0._16_4_ = uVar100;
      local_fe0._20_4_ = uVar100;
      local_fe0._24_4_ = uVar100;
      local_fe0._28_4_ = uVar100;
      auVar118 = vsubps_avx(local_fe0,auVar118);
      local_1540 = vsubps_avx(auVar180,auVar186);
      auVar180 = vsubps_avx(auVar181,auVar118);
      fVar227 = fVar310 + auVar186._0_4_;
      fVar229 = fVar312 + auVar186._4_4_;
      fVar231 = fVar314 + auVar186._8_4_;
      fVar233 = fVar316 + auVar186._12_4_;
      fVar235 = fVar318 + auVar186._16_4_;
      fVar237 = fVar320 + auVar186._20_4_;
      fVar262 = fVar322 + auVar186._24_4_;
      fVar271 = fVar173 + auVar118._0_4_;
      fVar289 = fVar190 + auVar118._4_4_;
      fVar291 = fVar194 + auVar118._8_4_;
      fVar293 = fVar198 + auVar118._12_4_;
      fVar295 = fVar225 + auVar118._16_4_;
      fVar297 = fVar230 + auVar118._20_4_;
      fVar299 = fVar234 + auVar118._24_4_;
      fVar224 = auVar118._28_4_;
      fVar301 = auVar181._28_4_ + fVar224;
      fVar240 = auVar180._0_4_;
      fVar253 = auVar180._4_4_;
      auVar30._4_4_ = fVar253 * fVar229;
      auVar30._0_4_ = fVar240 * fVar227;
      fVar287 = auVar180._8_4_;
      auVar30._8_4_ = fVar287 * fVar231;
      fVar292 = auVar180._12_4_;
      auVar30._12_4_ = fVar292 * fVar233;
      fVar296 = auVar180._16_4_;
      auVar30._16_4_ = fVar296 * fVar235;
      fVar300 = auVar180._20_4_;
      auVar30._20_4_ = fVar300 * fVar237;
      fVar309 = auVar180._24_4_;
      auVar30._24_4_ = fVar309 * fVar262;
      auVar30._28_4_ = fVar145;
      fVar140 = local_1540._0_4_;
      fVar141 = local_1540._4_4_;
      auVar31._4_4_ = fVar141 * fVar289;
      auVar31._0_4_ = fVar140 * fVar271;
      fVar317 = local_1540._8_4_;
      auVar31._8_4_ = fVar317 * fVar291;
      fVar321 = local_1540._12_4_;
      auVar31._12_4_ = fVar321 * fVar293;
      fVar324 = local_1540._16_4_;
      auVar31._16_4_ = fVar324 * fVar295;
      fVar326 = local_1540._20_4_;
      auVar31._20_4_ = fVar326 * fVar297;
      fVar328 = local_1540._24_4_;
      auVar31._24_4_ = fVar328 * fVar299;
      auVar31._28_4_ = fVar145 + fVar172;
      auVar180 = vsubps_avx(auVar31,auVar30);
      uVar100 = *(undefined4 *)(pRVar4 + (long)pRVar99);
      local_1000._4_4_ = uVar100;
      local_1000._0_4_ = uVar100;
      local_1000._8_4_ = uVar100;
      local_1000._12_4_ = uVar100;
      local_1000._16_4_ = uVar100;
      local_1000._20_4_ = uVar100;
      local_1000._24_4_ = uVar100;
      local_1000._28_4_ = uVar100;
      auVar179 = vsubps_avx(local_1000,auVar179);
      auVar181 = vsubps_avx(auVar16,auVar179);
      fVar175 = auVar181._0_4_;
      fVar192 = auVar181._4_4_;
      auVar32._4_4_ = fVar192 * fVar289;
      auVar32._0_4_ = fVar175 * fVar271;
      fVar196 = auVar181._8_4_;
      auVar32._8_4_ = fVar196 * fVar291;
      fVar200 = auVar181._12_4_;
      auVar32._12_4_ = fVar200 * fVar293;
      fVar228 = auVar181._16_4_;
      auVar32._16_4_ = fVar228 * fVar295;
      fVar232 = auVar181._20_4_;
      auVar32._20_4_ = fVar232 * fVar297;
      fVar236 = auVar181._24_4_;
      auVar32._24_4_ = fVar236 * fVar299;
      auVar32._28_4_ = fVar301;
      fVar271 = auVar179._0_4_ + fVar239;
      fVar289 = auVar179._4_4_ + fVar251;
      fVar291 = auVar179._8_4_ + fVar255;
      fVar293 = auVar179._12_4_ + fVar256;
      fVar295 = auVar179._16_4_ + fVar258;
      fVar297 = auVar179._20_4_ + fVar259;
      fVar299 = auVar179._24_4_ + fVar260;
      auVar33._4_4_ = fVar289 * fVar253;
      auVar33._0_4_ = fVar271 * fVar240;
      auVar33._8_4_ = fVar291 * fVar287;
      auVar33._12_4_ = fVar293 * fVar292;
      auVar33._16_4_ = fVar295 * fVar296;
      auVar33._20_4_ = fVar297 * fVar300;
      auVar33._24_4_ = fVar299 * fVar309;
      auVar33._28_4_ = uVar100;
      auVar181 = vsubps_avx(auVar33,auVar32);
      auVar34._4_4_ = fVar289 * fVar141;
      auVar34._0_4_ = fVar271 * fVar140;
      auVar34._8_4_ = fVar291 * fVar317;
      auVar34._12_4_ = fVar293 * fVar321;
      auVar34._16_4_ = fVar295 * fVar324;
      auVar34._20_4_ = fVar297 * fVar326;
      auVar34._24_4_ = fVar299 * fVar328;
      auVar34._28_4_ = fVar301;
      auVar35._4_4_ = fVar192 * fVar229;
      auVar35._0_4_ = fVar175 * fVar227;
      auVar35._8_4_ = fVar196 * fVar231;
      auVar35._12_4_ = fVar200 * fVar233;
      auVar35._16_4_ = fVar228 * fVar235;
      auVar35._20_4_ = fVar232 * fVar237;
      auVar35._24_4_ = fVar236 * fVar262;
      auVar35._28_4_ = fVar145 + auVar186._28_4_;
      auVar151 = vsubps_avx(auVar35,auVar34);
      fVar271 = auVar180._28_4_;
      fVar272 = fVar14 * auVar180._0_4_ + fVar266 * auVar181._0_4_ + auVar151._0_4_ * fVar280;
      fVar281 = fVar15 * auVar180._4_4_ + fVar261 * auVar181._4_4_ + auVar151._4_4_ * fVar282;
      auVar178._0_8_ = CONCAT44(fVar281,fVar272);
      auVar178._8_4_ =
           fVar267 * auVar180._8_4_ + fStack_15f8 * auVar181._8_4_ + auVar151._8_4_ * fVar283;
      auVar178._12_4_ =
           fVar268 * auVar180._12_4_ + fStack_15f4 * auVar181._12_4_ + auVar151._12_4_ * fVar284;
      auVar274._16_4_ =
           fVar269 * auVar180._16_4_ + fStack_15f0 * auVar181._16_4_ + auVar151._16_4_ * fVar285;
      auVar274._0_16_ = auVar178;
      auVar274._20_4_ =
           fVar270 * auVar180._20_4_ + fStack_15ec * auVar181._20_4_ + auVar151._20_4_ * fVar286;
      auVar276._24_4_ =
           fVar273 * auVar180._24_4_ + fStack_15e8 * auVar181._24_4_ + auVar151._24_4_ * fVar12;
      auVar276._0_24_ = auVar274;
      auVar276._28_4_ = fVar271 + auVar181._28_4_ + auVar151._28_4_;
      auVar180 = vsubps_avx(auVar179,auVar17);
      fVar289 = auVar179._0_4_ + auVar17._0_4_;
      fVar291 = auVar179._4_4_ + auVar17._4_4_;
      fVar293 = auVar179._8_4_ + auVar17._8_4_;
      fVar295 = auVar179._12_4_ + auVar17._12_4_;
      fVar297 = auVar179._16_4_ + auVar17._16_4_;
      fVar299 = auVar179._20_4_ + auVar17._20_4_;
      fVar301 = auVar179._24_4_ + auVar17._24_4_;
      auVar181 = vsubps_avx(auVar186,auVar263);
      fVar145 = auVar186._0_4_ + auVar263._0_4_;
      fVar162 = auVar186._4_4_ + auVar263._4_4_;
      fVar164 = auVar186._8_4_ + auVar263._8_4_;
      fVar166 = auVar186._12_4_ + auVar263._12_4_;
      fVar168 = auVar186._16_4_ + auVar263._16_4_;
      fVar170 = auVar186._20_4_ + auVar263._20_4_;
      fVar171 = auVar186._24_4_ + auVar263._24_4_;
      fVar172 = auVar186._28_4_ + fVar172;
      auVar186 = vsubps_avx(auVar118,auVar264);
      fVar174 = auVar118._0_4_ + auVar264._0_4_;
      fVar189 = auVar118._4_4_ + auVar264._4_4_;
      fVar191 = auVar118._8_4_ + auVar264._8_4_;
      fVar193 = auVar118._12_4_ + auVar264._12_4_;
      fVar195 = auVar118._16_4_ + auVar264._16_4_;
      fVar197 = auVar118._20_4_ + auVar264._20_4_;
      fVar199 = auVar118._24_4_ + auVar264._24_4_;
      fVar227 = auVar186._0_4_;
      fVar229 = auVar186._4_4_;
      auVar36._4_4_ = fVar162 * fVar229;
      auVar36._0_4_ = fVar145 * fVar227;
      fVar231 = auVar186._8_4_;
      auVar36._8_4_ = fVar164 * fVar231;
      fVar233 = auVar186._12_4_;
      auVar36._12_4_ = fVar166 * fVar233;
      fVar235 = auVar186._16_4_;
      auVar36._16_4_ = fVar168 * fVar235;
      fVar237 = auVar186._20_4_;
      auVar36._20_4_ = fVar170 * fVar237;
      fVar262 = auVar186._24_4_;
      auVar36._24_4_ = fVar171 * fVar262;
      auVar36._28_4_ = fVar224;
      fVar163 = auVar181._0_4_;
      fVar134 = auVar181._4_4_;
      auVar186._4_4_ = fVar134 * fVar189;
      auVar186._0_4_ = fVar163 * fVar174;
      fVar165 = auVar181._8_4_;
      auVar186._8_4_ = fVar165 * fVar191;
      fVar135 = auVar181._12_4_;
      auVar186._12_4_ = fVar135 * fVar193;
      fVar167 = auVar181._16_4_;
      auVar186._16_4_ = fVar167 * fVar195;
      fVar138 = auVar181._20_4_;
      auVar186._20_4_ = fVar138 * fVar197;
      fVar169 = auVar181._24_4_;
      auVar186._24_4_ = fVar169 * fVar199;
      auVar186._28_4_ = fVar271;
      auVar186 = vsubps_avx(auVar186,auVar36);
      fVar311 = auVar180._0_4_;
      fVar313 = auVar180._4_4_;
      auVar37._4_4_ = fVar313 * fVar189;
      auVar37._0_4_ = fVar311 * fVar174;
      fVar174 = auVar180._8_4_;
      auVar37._8_4_ = fVar174 * fVar191;
      fVar189 = auVar180._12_4_;
      auVar37._12_4_ = fVar189 * fVar193;
      fVar191 = auVar180._16_4_;
      auVar37._16_4_ = fVar191 * fVar195;
      fVar193 = auVar180._20_4_;
      auVar37._20_4_ = fVar193 * fVar197;
      fVar195 = auVar180._24_4_;
      auVar37._24_4_ = fVar195 * fVar199;
      auVar37._28_4_ = fVar224 + auVar264._28_4_;
      auVar38._4_4_ = fVar291 * fVar229;
      auVar38._0_4_ = fVar289 * fVar227;
      auVar38._8_4_ = fVar293 * fVar231;
      auVar38._12_4_ = fVar295 * fVar233;
      auVar38._16_4_ = fVar297 * fVar235;
      auVar38._20_4_ = fVar299 * fVar237;
      auVar38._24_4_ = fVar301 * fVar262;
      auVar38._28_4_ = fVar271;
      auVar118 = vsubps_avx(auVar38,auVar37);
      auVar39._4_4_ = fVar134 * fVar291;
      auVar39._0_4_ = fVar163 * fVar289;
      auVar39._8_4_ = fVar165 * fVar293;
      auVar39._12_4_ = fVar135 * fVar295;
      auVar39._16_4_ = fVar167 * fVar297;
      auVar39._20_4_ = fVar138 * fVar299;
      auVar39._24_4_ = fVar169 * fVar301;
      auVar39._28_4_ = auVar179._28_4_ + auVar17._28_4_;
      auVar17._4_4_ = fVar313 * fVar162;
      auVar17._0_4_ = fVar311 * fVar145;
      auVar17._8_4_ = fVar174 * fVar164;
      auVar17._12_4_ = fVar189 * fVar166;
      auVar17._16_4_ = fVar191 * fVar168;
      auVar17._20_4_ = fVar193 * fVar170;
      auVar17._24_4_ = fVar195 * fVar171;
      auVar17._28_4_ = fVar172;
      auVar179 = vsubps_avx(auVar17,auVar39);
      auVar121._0_4_ = fVar14 * auVar186._0_4_ + auVar179._0_4_ * fVar280 + fVar266 * auVar118._0_4_
      ;
      auVar121._4_4_ = fVar15 * auVar186._4_4_ + auVar179._4_4_ * fVar282 + fVar261 * auVar118._4_4_
      ;
      auVar121._8_4_ =
           fVar267 * auVar186._8_4_ + auVar179._8_4_ * fVar283 + fStack_15f8 * auVar118._8_4_;
      auVar121._12_4_ =
           fVar268 * auVar186._12_4_ + auVar179._12_4_ * fVar284 + fStack_15f4 * auVar118._12_4_;
      auVar121._16_4_ =
           fVar269 * auVar186._16_4_ + auVar179._16_4_ * fVar285 + fStack_15f0 * auVar118._16_4_;
      auVar121._20_4_ =
           fVar270 * auVar186._20_4_ + auVar179._20_4_ * fVar286 + fStack_15ec * auVar118._20_4_;
      auVar121._24_4_ =
           fVar273 * auVar186._24_4_ + auVar179._24_4_ * fVar12 + fStack_15e8 * auVar118._24_4_;
      auVar121._28_4_ = fVar172 + auVar179._28_4_ + fVar172;
      auVar206._0_4_ = auVar121._0_4_ + fVar302 + fVar272;
      auVar206._4_4_ = auVar121._4_4_ + fVar306 + fVar281;
      auVar206._8_4_ = auVar121._8_4_ + auVar216._8_4_ + auVar178._8_4_;
      auVar206._12_4_ = auVar121._12_4_ + auVar216._12_4_ + auVar178._12_4_;
      auVar206._16_4_ = auVar121._16_4_ + auVar303._16_4_ + auVar274._16_4_;
      auVar206._20_4_ = auVar121._20_4_ + auVar303._20_4_ + auVar274._20_4_;
      auVar206._24_4_ = auVar121._24_4_ + auVar304._24_4_ + auVar276._24_4_;
      auVar206._28_4_ = auVar121._28_4_ + auVar304._28_4_ + auVar276._28_4_;
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar247,auVar206);
      fVar172 = auVar186._0_4_ * 1.1920929e-07;
      fVar224 = auVar186._4_4_ * 1.1920929e-07;
      auVar40._4_4_ = fVar224;
      auVar40._0_4_ = fVar172;
      fVar271 = auVar186._8_4_ * 1.1920929e-07;
      auVar40._8_4_ = fVar271;
      fVar280 = auVar186._12_4_ * 1.1920929e-07;
      auVar40._12_4_ = fVar280;
      fVar282 = auVar186._16_4_ * 1.1920929e-07;
      auVar40._16_4_ = fVar282;
      fVar283 = auVar186._20_4_ * 1.1920929e-07;
      auVar40._20_4_ = fVar283;
      fVar284 = auVar186._24_4_ * 1.1920929e-07;
      auVar40._24_4_ = fVar284;
      auVar40._28_4_ = auVar186._28_4_;
      auVar118 = vminps_avx(auVar304,auVar276);
      auVar118 = vminps_avx(auVar118,auVar121);
      auVar221._0_8_ = CONCAT44(fVar224,fVar172) ^ 0x8000000080000000;
      auVar221._8_4_ = -fVar271;
      auVar221._12_4_ = -fVar280;
      auVar221._16_4_ = -fVar282;
      auVar221._20_4_ = -fVar283;
      auVar221._24_4_ = -fVar284;
      auVar221._28_4_ = auVar186._28_4_ ^ 0x80000000;
      auVar118 = vcmpps_avx(auVar118,auVar221,5);
      auVar179 = vmaxps_avx(auVar304,auVar276);
      auVar186 = vmaxps_avx(auVar179,auVar121);
      auVar186 = vcmpps_avx(auVar186,auVar40,2);
      auVar180 = vorps_avx(auVar118,auVar186);
      auVar181 = local_1860 & auVar180;
      auVar186 = vandps_avx(auVar180,local_1860);
      if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar181 >> 0x7f,0) != '\0') ||
            (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar181 >> 0xbf,0) != '\0') ||
          (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar181[0x1f] < '\0') {
        auVar41._4_4_ = fVar241 * fVar141;
        auVar41._0_4_ = fVar238 * fVar140;
        auVar41._8_4_ = fVar254 * fVar317;
        auVar41._12_4_ = fVar290 * fVar321;
        auVar41._16_4_ = fVar294 * fVar324;
        auVar41._20_4_ = fVar298 * fVar326;
        auVar41._24_4_ = fVar307 * fVar328;
        auVar41._28_4_ = auVar180._28_4_;
        uStack_1724 = auVar275._28_4_;
        auVar42._4_4_ = fVar253 * fVar137;
        auVar42._0_4_ = fVar240 * fVar131;
        auVar42._8_4_ = fVar287 * fVar143;
        auVar42._12_4_ = fVar292 * fVar136;
        auVar42._16_4_ = fVar296 * fVar142;
        auVar42._20_4_ = fVar300 * fVar10;
        auVar42._24_4_ = fVar309 * fVar257;
        auVar42._28_4_ = local_1860._28_4_;
        auVar181 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = fVar134 * fVar253;
        auVar43._0_4_ = fVar163 * fVar240;
        auVar43._8_4_ = fVar165 * fVar287;
        auVar43._12_4_ = fVar135 * fVar292;
        auVar43._16_4_ = fVar167 * fVar296;
        auVar43._20_4_ = fVar138 * fVar300;
        auVar43._24_4_ = fVar169 * fVar309;
        auVar43._28_4_ = auVar118._28_4_;
        auVar44._4_4_ = fVar141 * fVar229;
        auVar44._0_4_ = fVar140 * fVar227;
        auVar44._8_4_ = fVar317 * fVar231;
        auVar44._12_4_ = fVar321 * fVar233;
        auVar44._16_4_ = fVar324 * fVar235;
        auVar44._20_4_ = fVar326 * fVar237;
        auVar44._24_4_ = fVar328 * fVar262;
        auVar44._28_4_ = auVar179._28_4_;
        auVar263 = vsubps_avx(auVar44,auVar43);
        auVar118 = vandps_avx(auVar247,auVar41);
        auVar179 = vandps_avx(auVar247,auVar43);
        auVar118 = vcmpps_avx(auVar118,auVar179,1);
        auVar180 = vblendvps_avx(auVar263,auVar181,auVar118);
        auVar45._4_4_ = fVar192 * fVar229;
        auVar45._0_4_ = fVar175 * fVar227;
        auVar45._8_4_ = fVar196 * fVar231;
        auVar45._12_4_ = fVar200 * fVar233;
        auVar45._16_4_ = fVar228 * fVar235;
        auVar45._20_4_ = fVar232 * fVar237;
        auVar45._24_4_ = fVar236 * fVar262;
        auVar45._28_4_ = auVar118._28_4_;
        auVar46._4_4_ = fVar192 * fVar241;
        auVar46._0_4_ = fVar175 * fVar238;
        auVar46._8_4_ = fVar196 * fVar254;
        auVar46._12_4_ = fVar200 * fVar290;
        auVar46._16_4_ = fVar228 * fVar294;
        auVar46._20_4_ = fVar232 * fVar298;
        auVar46._24_4_ = fVar236 * fVar307;
        auVar46._28_4_ = auVar181._28_4_;
        auVar47._4_4_ = fVar139 * fVar253;
        auVar47._0_4_ = fVar133 * fVar240;
        auVar47._8_4_ = fVar132 * fVar287;
        auVar47._12_4_ = fVar252 * fVar292;
        auVar47._16_4_ = fVar144 * fVar296;
        auVar47._20_4_ = fVar11 * fVar300;
        auVar47._24_4_ = fVar13 * fVar309;
        auVar47._28_4_ = *(undefined4 *)(ray + 0xdc);
        auVar264 = vsubps_avx(auVar46,auVar47);
        auVar48._4_4_ = fVar313 * fVar253;
        auVar48._0_4_ = fVar311 * fVar240;
        auVar48._8_4_ = fVar174 * fVar287;
        auVar48._12_4_ = fVar189 * fVar292;
        auVar48._16_4_ = fVar191 * fVar296;
        auVar48._20_4_ = fVar193 * fVar300;
        auVar48._24_4_ = fVar195 * fVar309;
        auVar48._28_4_ = auVar263._28_4_;
        auVar263 = vsubps_avx(auVar48,auVar45);
        auVar118 = vandps_avx(auVar247,auVar47);
        auVar179 = vandps_avx(auVar247,auVar45);
        auVar118 = vcmpps_avx(auVar118,auVar179,1);
        auVar181 = vblendvps_avx(auVar263,auVar264,auVar118);
        auVar49._4_4_ = fVar313 * fVar141;
        auVar49._0_4_ = fVar311 * fVar140;
        auVar49._8_4_ = fVar174 * fVar317;
        auVar49._12_4_ = fVar189 * fVar321;
        auVar49._16_4_ = fVar191 * fVar324;
        auVar49._20_4_ = fVar193 * fVar326;
        auVar49._24_4_ = fVar195 * fVar328;
        auVar49._28_4_ = auVar118._28_4_;
        auVar50._4_4_ = fVar139 * fVar141;
        auVar50._0_4_ = fVar133 * fVar140;
        auVar50._8_4_ = fVar132 * fVar317;
        auVar50._12_4_ = fVar252 * fVar321;
        auVar50._16_4_ = fVar144 * fVar324;
        auVar50._20_4_ = fVar11 * fVar326;
        auVar50._24_4_ = fVar13 * fVar328;
        auVar50._28_4_ = auVar264._28_4_;
        auVar51._4_4_ = fVar192 * fVar137;
        auVar51._0_4_ = fVar175 * fVar131;
        auVar51._8_4_ = fVar196 * fVar143;
        auVar51._12_4_ = fVar200 * fVar136;
        auVar51._16_4_ = fVar228 * fVar142;
        auVar51._20_4_ = fVar232 * fVar10;
        auVar51._24_4_ = fVar236 * fVar257;
        auVar51._28_4_ = auVar263._28_4_;
        auVar52._4_4_ = fVar192 * fVar134;
        auVar52._0_4_ = fVar175 * fVar163;
        auVar52._8_4_ = fVar196 * fVar165;
        auVar52._12_4_ = fVar200 * fVar135;
        auVar52._16_4_ = fVar228 * fVar167;
        auVar52._20_4_ = fVar232 * fVar138;
        auVar52._24_4_ = fVar236 * fVar169;
        auVar52._28_4_ = uStack_1724;
        auVar263 = vsubps_avx(auVar50,auVar51);
        auVar264 = vsubps_avx(auVar52,auVar49);
        auVar118 = vandps_avx(auVar247,auVar51);
        auVar179 = vandps_avx(auVar247,auVar49);
        auVar118 = vcmpps_avx(auVar118,auVar179,1);
        auVar179 = vblendvps_avx(auVar264,auVar263,auVar118);
        local_1640._0_4_ = auVar93._0_4_;
        local_1640._4_4_ = auVar93._4_4_;
        auStack_1638._0_4_ = auVar93._8_4_;
        auStack_1638._4_4_ = auVar93._12_4_;
        fStack_1630 = auVar93._16_4_;
        fStack_162c = auVar93._20_4_;
        fStack_1628 = auVar93._24_4_;
        fVar172 = auVar263._28_4_;
        local_1660._0_4_ = auVar94._0_4_;
        local_1660._4_4_ = auVar94._4_4_;
        auStack_1658._0_4_ = auVar94._8_4_;
        auStack_1658._4_4_ = auVar94._12_4_;
        fStack_1650 = auVar94._16_4_;
        fStack_164c = auVar94._20_4_;
        fStack_1648 = auVar94._24_4_;
        fVar224 = auVar180._0_4_ * (float)local_1660 +
                  auVar179._0_4_ * (float)local_1640 + auVar181._0_4_ * fVar266;
        fVar131 = auVar180._4_4_ * local_1660._4_4_ +
                  auVar179._4_4_ * local_1640._4_4_ + auVar181._4_4_ * fVar261;
        fVar133 = auVar180._8_4_ * (float)auStack_1658._0_4_ +
                  auVar179._8_4_ * (float)auStack_1638._0_4_ + auVar181._8_4_ * fStack_15f8;
        fVar227 = auVar180._12_4_ * (float)auStack_1658._4_4_ +
                  auVar179._12_4_ * (float)auStack_1638._4_4_ + auVar181._12_4_ * fStack_15f4;
        fVar137 = auVar180._16_4_ * fStack_1650 +
                  auVar179._16_4_ * fStack_1630 + auVar181._16_4_ * fStack_15f0;
        fVar139 = auVar180._20_4_ * fStack_164c +
                  auVar179._20_4_ * fStack_162c + auVar181._20_4_ * fStack_15ec;
        fVar229 = auVar180._24_4_ * fStack_1648 +
                  auVar179._24_4_ * fStack_1628 + auVar181._24_4_ * fStack_15e8;
        fVar143 = fVar172 + auVar118._28_4_ + fVar172;
        auVar122._0_4_ = fVar224 + fVar224;
        auVar122._4_4_ = fVar131 + fVar131;
        auVar122._8_4_ = fVar133 + fVar133;
        auVar122._12_4_ = fVar227 + fVar227;
        auVar122._16_4_ = fVar137 + fVar137;
        auVar122._20_4_ = fVar139 + fVar139;
        auVar122._24_4_ = fVar229 + fVar229;
        auVar122._28_4_ = fVar143 + fVar143;
        fVar224 = auVar180._0_4_ * fVar239 + auVar179._0_4_ * fVar173 + auVar181._0_4_ * fVar310;
        fVar131 = auVar180._4_4_ * fVar251 + auVar179._4_4_ * fVar190 + auVar181._4_4_ * fVar312;
        fVar133 = auVar180._8_4_ * fVar255 + auVar179._8_4_ * fVar194 + auVar181._8_4_ * fVar314;
        fVar227 = auVar180._12_4_ * fVar256 + auVar179._12_4_ * fVar198 + auVar181._12_4_ * fVar316;
        fVar137 = auVar180._16_4_ * fVar258 + auVar179._16_4_ * fVar225 + auVar181._16_4_ * fVar318;
        fVar139 = auVar180._20_4_ * fVar259 + auVar179._20_4_ * fVar230 + auVar181._20_4_ * fVar320;
        fVar229 = auVar180._24_4_ * fVar260 + auVar179._24_4_ * fVar234 + auVar181._24_4_ * fVar322;
        fVar172 = (float)local_1540._28_4_ + fVar172 + auVar264._28_4_;
        auVar118 = vrcpps_avx(auVar122);
        fVar239 = auVar118._0_4_;
        fVar251 = auVar118._4_4_;
        auVar53._4_4_ = auVar122._4_4_ * fVar251;
        auVar53._0_4_ = auVar122._0_4_ * fVar239;
        fVar255 = auVar118._8_4_;
        auVar53._8_4_ = auVar122._8_4_ * fVar255;
        fVar256 = auVar118._12_4_;
        auVar53._12_4_ = auVar122._12_4_ * fVar256;
        fVar258 = auVar118._16_4_;
        auVar53._16_4_ = auVar122._16_4_ * fVar258;
        fVar259 = auVar118._20_4_;
        auVar53._20_4_ = auVar122._20_4_ * fVar259;
        fVar260 = auVar118._24_4_;
        auVar53._24_4_ = auVar122._24_4_ * fVar260;
        auVar53._28_4_ = auVar264._28_4_;
        auVar265._8_4_ = 0x3f800000;
        auVar265._0_8_ = &DAT_3f8000003f800000;
        auVar265._12_4_ = 0x3f800000;
        auVar265._16_4_ = 0x3f800000;
        auVar265._20_4_ = 0x3f800000;
        auVar265._24_4_ = 0x3f800000;
        auVar265._28_4_ = 0x3f800000;
        auVar118 = vsubps_avx(auVar265,auVar53);
        auVar54._4_4_ = (fVar131 + fVar131) * (fVar251 + fVar251 * auVar118._4_4_);
        auVar54._0_4_ = (fVar224 + fVar224) * (fVar239 + fVar239 * auVar118._0_4_);
        auVar54._8_4_ = (fVar133 + fVar133) * (fVar255 + fVar255 * auVar118._8_4_);
        auVar54._12_4_ = (fVar227 + fVar227) * (fVar256 + fVar256 * auVar118._12_4_);
        auVar54._16_4_ = (fVar137 + fVar137) * (fVar258 + fVar258 * auVar118._16_4_);
        auVar54._20_4_ = (fVar139 + fVar139) * (fVar259 + fVar259 * auVar118._20_4_);
        auVar54._24_4_ = (fVar229 + fVar229) * (fVar260 + fVar260 * auVar118._24_4_);
        auVar54._28_4_ = fVar172 + fVar172;
        auVar118 = vcmpps_avx(auVar54,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar263 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar54,2);
        auVar118 = vandps_avx(auVar263,auVar118);
        auVar263 = vcmpps_avx(auVar122,_DAT_02020f00,4);
        auVar118 = vandps_avx(auVar263,auVar118);
        auVar201 = vpslld_avx(auVar118._0_16_,0x1f);
        auVar202 = vpsrad_avx(auVar201,0x1f);
        auVar201 = vpslld_avx(auVar118._16_16_,0x1f);
        auVar201 = vpsrad_avx(auVar201,0x1f);
        auVar123._16_16_ = auVar201;
        auVar123._0_16_ = auVar202;
        auVar118 = auVar186 & auVar123;
        auVar186 = vandps_avx(auVar186,auVar123);
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          local_1560._8_8_ = auVar216._8_8_;
          local_1560._16_8_ = auVar303._16_8_;
          local_1560._24_8_ = auVar304._24_8_;
          local_1020 = auVar216._0_8_;
          uStack_1018 = local_1560._8_8_;
          uStack_1010 = local_1560._16_8_;
          uStack_1008 = local_1560._24_8_;
          local_1580._8_8_ = auVar178._8_8_;
          local_1580._16_8_ = auVar274._16_8_;
          local_1580._24_8_ = auVar276._24_8_;
          local_1040 = auVar178._0_8_;
          uStack_1038 = local_1580._8_8_;
          uStack_1030 = local_1580._16_8_;
          uStack_1028 = local_1580._24_8_;
          local_1060 = auVar206;
          local_1080 = auVar54;
          local_10a0 = auVar180;
          local_10c0 = auVar181;
          local_10e0 = auVar179;
        }
      }
      auVar305 = ZEXT3264(local_1760);
      auVar308 = ZEXT3264(local_1780);
      auVar315 = ZEXT3264(local_17a0);
      auVar319 = ZEXT3264(local_17c0);
      uVar100 = *(undefined4 *)(local_1930 + local_1600);
      auVar277._4_4_ = uVar100;
      auVar277._0_4_ = uVar100;
      auVar277._8_4_ = uVar100;
      auVar277._12_4_ = uVar100;
      auVar277._16_4_ = uVar100;
      auVar277._20_4_ = uVar100;
      auVar277._24_4_ = uVar100;
      auVar277._28_4_ = uVar100;
      _auStack_1638 = SUB3224(*(undefined1 (*) [32])pRVar98,8);
      local_1640 = lVar109;
      uVar5 = *(undefined4 *)(local_1930 + lVar109);
      local_1740._4_4_ = uVar5;
      local_1740._0_4_ = uVar5;
      fStack_1738 = (float)uVar5;
      fStack_1734 = (float)uVar5;
      fStack_1730 = (float)uVar5;
      fStack_172c = (float)uVar5;
      fStack_1728 = (float)uVar5;
      uStack_1724 = uVar5;
      _auStack_1658 = SUB3224(*(undefined1 (*) [32])pRVar3,8);
      local_1660 = lVar102;
      uVar5 = *(undefined4 *)(local_1930 + lVar102);
      local_1680._4_4_ = uVar5;
      local_1680._0_4_ = uVar5;
      local_1680._8_4_ = uVar5;
      local_1680._12_4_ = uVar5;
      local_1680._16_4_ = uVar5;
      local_1680._20_4_ = uVar5;
      local_1680._24_4_ = uVar5;
      local_1680._28_4_ = uVar5;
      pRVar98 = (RayK<8> *)(ulong)*(uint *)(local_1930 + 0x18);
      pGVar7 = (context->scene->geometries).items[(long)pRVar98].ptr;
      uVar103 = pGVar7->mask;
      auVar154._4_4_ = uVar103;
      auVar154._0_4_ = uVar103;
      auVar154._8_4_ = uVar103;
      auVar154._12_4_ = uVar103;
      auVar154._16_4_ = uVar103;
      auVar154._20_4_ = uVar103;
      auVar154._24_4_ = uVar103;
      auVar154._28_4_ = uVar103;
      auVar118 = vandps_avx(auVar154,*(undefined1 (*) [32])(ray + 0x120));
      auVar178 = vpcmpeqd_avx(auVar118._16_16_,ZEXT816(0) << 0x40);
      auVar201 = vpcmpeqd_avx(auVar118._0_16_,ZEXT816(0) << 0x40);
      auVar184._16_16_ = auVar178;
      auVar184._0_16_ = auVar186._0_16_;
      auVar118 = vblendps_avx(ZEXT1632(auVar201),auVar184,0xf0);
      auVar179 = auVar186 & ~auVar118;
      local_13c0 = ZEXT432(0xffff);
      local_16a8 = pRVar99;
      auVar180 = local_1680;
      local_17f0.ray = (RTCRayN *)ray;
      if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar179 >> 0x7f,0) != '\0') ||
            (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar179 >> 0xbf,0) != '\0') ||
          (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar179[0x1f] < '\0') {
        local_1840._0_32_ = vandnps_avx(auVar118,auVar186);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar118 = vrcpps_avx(local_1060);
          auVar186 = vandps_avx(auVar247,local_1060);
          fVar239 = auVar118._0_4_;
          fVar251 = auVar118._4_4_;
          auVar86._4_4_ = local_1060._4_4_ * fVar251;
          auVar86._0_4_ = local_1060._0_4_ * fVar239;
          fVar255 = auVar118._8_4_;
          auVar86._8_4_ = local_1060._8_4_ * fVar255;
          fVar256 = auVar118._12_4_;
          auVar86._12_4_ = local_1060._12_4_ * fVar256;
          fVar258 = auVar118._16_4_;
          auVar86._16_4_ = local_1060._16_4_ * fVar258;
          fVar259 = auVar118._20_4_;
          auVar86._20_4_ = local_1060._20_4_ * fVar259;
          fVar260 = auVar118._24_4_;
          auVar86._24_4_ = local_1060._24_4_ * fVar260;
          auVar86._28_4_ = local_1060._28_4_;
          auVar222._8_4_ = 0x3f800000;
          auVar222._0_8_ = &DAT_3f8000003f800000;
          auVar222._12_4_ = 0x3f800000;
          auVar222._16_4_ = 0x3f800000;
          auVar222._20_4_ = 0x3f800000;
          auVar222._24_4_ = 0x3f800000;
          auVar222._28_4_ = 0x3f800000;
          auVar179 = vsubps_avx(auVar222,auVar86);
          auVar156._0_4_ = fVar239 + fVar239 * auVar179._0_4_;
          auVar156._4_4_ = fVar251 + fVar251 * auVar179._4_4_;
          auVar156._8_4_ = fVar255 + fVar255 * auVar179._8_4_;
          auVar156._12_4_ = fVar256 + fVar256 * auVar179._12_4_;
          auVar156._16_4_ = fVar258 + fVar258 * auVar179._16_4_;
          auVar156._20_4_ = fVar259 + fVar259 * auVar179._20_4_;
          auVar156._24_4_ = fVar260 + fVar260 * auVar179._24_4_;
          auVar156._28_4_ = auVar118._28_4_ + auVar179._28_4_;
          auVar208._8_4_ = 0x219392ef;
          auVar208._0_8_ = 0x219392ef219392ef;
          auVar208._12_4_ = 0x219392ef;
          auVar208._16_4_ = 0x219392ef;
          auVar208._20_4_ = 0x219392ef;
          auVar208._24_4_ = 0x219392ef;
          auVar208._28_4_ = 0x219392ef;
          auVar186 = vcmpps_avx(auVar186,auVar208,5);
          auVar186 = vandps_avx(auVar186,auVar156);
          auVar87._4_4_ = auVar186._4_4_ * local_1020._4_4_;
          auVar87._0_4_ = auVar186._0_4_ * (float)local_1020;
          auVar87._8_4_ = auVar186._8_4_ * (float)uStack_1018;
          auVar87._12_4_ = auVar186._12_4_ * uStack_1018._4_4_;
          auVar87._16_4_ = auVar186._16_4_ * (float)uStack_1010;
          auVar87._20_4_ = auVar186._20_4_ * uStack_1010._4_4_;
          auVar87._24_4_ = auVar186._24_4_ * (float)uStack_1008;
          auVar87._28_4_ = auVar156._28_4_;
          auVar180 = vminps_avx(auVar87,auVar222);
          auVar88._4_4_ = auVar186._4_4_ * local_1040._4_4_;
          auVar88._0_4_ = auVar186._0_4_ * (float)local_1040;
          auVar88._8_4_ = auVar186._8_4_ * (float)uStack_1038;
          auVar88._12_4_ = auVar186._12_4_ * uStack_1038._4_4_;
          auVar88._16_4_ = auVar186._16_4_ * (float)uStack_1030;
          auVar88._20_4_ = auVar186._20_4_ * uStack_1030._4_4_;
          auVar88._24_4_ = auVar186._24_4_ * (float)uStack_1028;
          auVar88._28_4_ = auVar186._28_4_;
          auVar181 = vminps_avx(auVar88,auVar222);
          uVar5 = *(undefined4 *)(local_1930 + local_18f8 + -4);
          auVar214._4_4_ = uVar5;
          auVar214._0_4_ = uVar5;
          auVar214._8_4_ = uVar5;
          auVar214._12_4_ = uVar5;
          uVar5 = *(undefined4 *)(local_1930 + local_18f0);
          auVar202._4_4_ = uVar5;
          auVar202._0_4_ = uVar5;
          auVar202._8_4_ = uVar5;
          auVar202._12_4_ = uVar5;
          auVar186 = vandps_avx(ZEXT1632(auVar214),ZEXT432(0xffff));
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar178 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar178 = vshufps_avx(auVar178,auVar178,0);
          auVar218._0_16_ = vpsrld_avx(auVar214,0x10);
          auVar218._16_16_ = auVar218._0_16_;
          auVar118 = vcvtdq2ps_avx(auVar218);
          auVar186 = vsubps_avx(auVar222,auVar180);
          auVar263 = vsubps_avx(auVar186,auVar181);
          auVar186 = vandps_avx(ZEXT432(0xffff),ZEXT1632(auVar202));
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar201 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar201 = vshufps_avx(auVar201,auVar201,0);
          auVar209._0_16_ = vpsrld_avx(auVar202,0x10);
          auVar209._16_16_ = auVar209._0_16_;
          auVar179 = vcvtdq2ps_avx(auVar209);
          uVar5 = *(undefined4 *)(local_1930 + local_18f8);
          auVar203._4_4_ = uVar5;
          auVar203._0_4_ = uVar5;
          auVar203._8_4_ = uVar5;
          auVar203._12_4_ = uVar5;
          auVar186 = vandps_avx(ZEXT432(0xffff),ZEXT1632(auVar203));
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar216 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar216 = vshufps_avx(auVar216,auVar216,0);
          auVar210._0_16_ = vpsrld_avx(auVar203,0x10);
          auVar210._16_16_ = auVar210._0_16_;
          auVar186 = vcvtdq2ps_avx(auVar210);
          pRVar8 = context->user;
          local_1380 = local_10a0._0_8_;
          uStack_1378 = local_10a0._8_8_;
          uStack_1370 = local_10a0._16_8_;
          uStack_1368 = local_10a0._24_8_;
          local_1360 = local_10c0._0_8_;
          uStack_1358 = local_10c0._8_8_;
          uStack_1350 = local_10c0._16_8_;
          uStack_1348 = local_10c0._24_8_;
          local_1340 = local_10e0._0_8_;
          uStack_1338 = local_10e0._8_8_;
          uStack_1330 = local_10e0._16_8_;
          uStack_1328 = local_10e0._24_8_;
          local_1320._4_4_ =
               auVar180._4_4_ * auVar216._4_4_ +
               auVar263._4_4_ * auVar178._4_4_ + auVar181._4_4_ * auVar201._4_4_;
          local_1320._0_4_ =
               auVar180._0_4_ * auVar216._0_4_ +
               auVar263._0_4_ * auVar178._0_4_ + auVar181._0_4_ * auVar201._0_4_;
          fStack_1318 = auVar180._8_4_ * auVar216._8_4_ +
                        auVar263._8_4_ * auVar178._8_4_ + auVar181._8_4_ * auVar201._8_4_;
          fStack_1314 = auVar180._12_4_ * auVar216._12_4_ +
                        auVar263._12_4_ * auVar178._12_4_ + auVar181._12_4_ * auVar201._12_4_;
          fStack_1310 = auVar180._16_4_ * auVar216._0_4_ +
                        auVar263._16_4_ * auVar178._0_4_ + auVar181._16_4_ * auVar201._0_4_;
          fStack_130c = auVar180._20_4_ * auVar216._4_4_ +
                        auVar263._20_4_ * auVar178._4_4_ + auVar181._20_4_ * auVar201._4_4_;
          fStack_1308 = auVar180._24_4_ * auVar216._8_4_ +
                        auVar263._24_4_ * auVar178._8_4_ + auVar181._24_4_ * auVar201._8_4_;
          fStack_1304 = auVar216._12_4_ + auVar178._12_4_ + auVar201._12_4_;
          local_12b0 = vpshufd_avx(ZEXT416(*(uint *)(local_1930 + 0x18)),0);
          local_1300 = auVar180._0_4_ * auVar186._0_4_ * 0.00012207031 +
                       auVar263._0_4_ * auVar118._0_4_ * 0.00012207031 +
                       auVar181._0_4_ * auVar179._0_4_ * 0.00012207031;
          fStack_12fc = auVar180._4_4_ * auVar186._4_4_ * 0.00012207031 +
                        auVar263._4_4_ * auVar118._4_4_ * 0.00012207031 +
                        auVar181._4_4_ * auVar179._4_4_ * 0.00012207031;
          fStack_12f8 = auVar180._8_4_ * auVar186._8_4_ * 0.00012207031 +
                        auVar263._8_4_ * auVar118._8_4_ * 0.00012207031 +
                        auVar181._8_4_ * auVar179._8_4_ * 0.00012207031;
          fStack_12f4 = auVar180._12_4_ * auVar186._12_4_ * 0.00012207031 +
                        auVar263._12_4_ * auVar118._12_4_ * 0.00012207031 +
                        auVar181._12_4_ * auVar179._12_4_ * 0.00012207031;
          fStack_12f0 = auVar180._16_4_ * auVar186._16_4_ * 0.00012207031 +
                        auVar263._16_4_ * auVar118._16_4_ * 0.00012207031 +
                        auVar181._16_4_ * auVar179._16_4_ * 0.00012207031;
          fStack_12ec = auVar180._20_4_ * auVar186._20_4_ * 0.00012207031 +
                        auVar263._20_4_ * auVar118._20_4_ * 0.00012207031 +
                        auVar181._20_4_ * auVar179._20_4_ * 0.00012207031;
          fStack_12e8 = auVar180._24_4_ * auVar186._24_4_ * 0.00012207031 +
                        auVar263._24_4_ * auVar118._24_4_ * 0.00012207031 +
                        auVar181._24_4_ * auVar179._24_4_ * 0.00012207031;
          fStack_12e4 = auVar180._28_4_ + auVar118._28_4_ + auVar181._28_4_;
          local_12d0 = vpshufd_avx(ZEXT416(*(uint *)(local_1930 + 0x1c)),0);
          local_12e0 = local_12d0;
          local_12c0 = local_12b0;
          auVar118 = vcmpps_avx(ZEXT1632(local_12b0),ZEXT1632(local_12b0),0xf);
          local_1810[1] = auVar118;
          *local_1810 = auVar118;
          local_12a0 = pRVar8->instID[0];
          uStack_129c = local_12a0;
          uStack_1298 = local_12a0;
          uStack_1294 = local_12a0;
          uStack_1290 = local_12a0;
          uStack_128c = local_12a0;
          uStack_1288 = local_12a0;
          uStack_1284 = local_12a0;
          local_1280 = pRVar8->instPrimID[0];
          uStack_127c = local_1280;
          uStack_1278 = local_1280;
          uStack_1274 = local_1280;
          uStack_1270 = local_1280;
          uStack_126c = local_1280;
          uStack_1268 = local_1280;
          uStack_1264 = local_1280;
          local_1720 = *(undefined1 (*) [32])(ray + 0x100);
          auVar186 = vblendvps_avx(local_1720,local_1080,local_1840._0_32_);
          *(undefined1 (*) [32])(ray + 0x100) = auVar186;
          local_17f0.valid = (int *)local_1840;
          local_17f0.geometryUserPtr = pGVar7->userPtr;
          local_17f0.context = context->user;
          local_17f0.hit = (RTCHitN *)&local_1380;
          local_17f0.N = 8;
          local_1580 = auVar276;
          local_1560 = auVar304;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar186 = ZEXT1632(auVar118._0_16_);
            (*pGVar7->occlusionFilterN)(&local_17f0);
            auVar118 = vcmpps_avx(auVar186,auVar186,0xf);
            auVar319 = ZEXT3264(local_17c0);
            auVar315 = ZEXT3264(local_17a0);
            auVar308 = ZEXT3264(local_1780);
            auVar305 = ZEXT3264(local_1760);
          }
          auVar178 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._0_16_);
          auVar201 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._16_16_);
          auVar127._16_16_ = auVar201;
          auVar127._0_16_ = auVar178;
          auVar186 = auVar118 & ~auVar127;
          if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar186 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar186 >> 0x7f,0) == '\0') &&
                (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar186 >> 0xbf,0) == '\0') &&
              (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar186[0x1f]) {
            local_1840._0_4_ = auVar178._0_4_ ^ auVar118._0_4_;
            local_1840._4_4_ = auVar178._4_4_ ^ auVar118._4_4_;
            local_1840._8_4_ = auVar178._8_4_ ^ auVar118._8_4_;
            local_1840._12_4_ = auVar178._12_4_ ^ auVar118._12_4_;
            local_1840._16_4_ = auVar201._0_4_ ^ auVar118._16_4_;
            local_1840._20_4_ = auVar201._4_4_ ^ auVar118._20_4_;
            local_1840._24_4_ = auVar201._8_4_ ^ auVar118._24_4_;
            local_1840._28_4_ = auVar201._12_4_ ^ auVar118._28_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_17f0);
              auVar319 = ZEXT3264(local_17c0);
              auVar315 = ZEXT3264(local_17a0);
              auVar308 = ZEXT3264(local_1780);
              auVar305 = ZEXT3264(local_1760);
            }
            auVar178 = vpcmpeqd_avx((undefined1  [16])0x0,local_1840._0_16_);
            auVar201 = vpcmpeqd_avx((undefined1  [16])0x0,local_1840._16_16_);
            auVar158._16_16_ = auVar201;
            auVar158._0_16_ = auVar178;
            local_1840._0_8_ = auVar178._0_8_ ^ 0xffffffffffffffff;
            local_1840._8_4_ = auVar178._8_4_ ^ 0xffffffff;
            local_1840._12_4_ = auVar178._12_4_ ^ 0xffffffff;
            local_1840._16_4_ = auVar201._0_4_ ^ 0xffffffff;
            local_1840._20_4_ = auVar201._4_4_ ^ 0xffffffff;
            local_1840._24_4_ = auVar201._8_4_ ^ 0xffffffff;
            local_1840._28_4_ = auVar201._12_4_ ^ 0xffffffff;
            auVar187._8_4_ = 0xff800000;
            auVar187._0_8_ = 0xff800000ff800000;
            auVar187._12_4_ = 0xff800000;
            auVar187._16_4_ = 0xff800000;
            auVar187._20_4_ = 0xff800000;
            auVar187._24_4_ = 0xff800000;
            auVar187._28_4_ = 0xff800000;
            auVar186 = vblendvps_avx(auVar187,*(undefined1 (*) [32])(local_17f0.ray + 0x100),
                                     auVar158);
            *(undefined1 (*) [32])(local_17f0.ray + 0x100) = auVar186;
          }
          auVar186 = vblendvps_avx(local_1720,*(undefined1 (*) [32])pRVar2,local_1840._0_32_);
          *(undefined1 (*) [32])pRVar2 = auVar186;
          pRVar98 = pRVar2;
        }
        local_1860 = vandnps_avx(local_1840._0_32_,local_1860);
        auVar180 = local_1680;
      }
      pRVar99 = pRVar98;
      if ((((((((local_1860 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_1860 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_1860 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_1860 >> 0x7f,0) == '\0') &&
            (local_1860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_1860 >> 0xbf,0) == '\0') &&
          (local_1860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_1860[0x1f]) break;
      auVar186 = *(undefined1 (*) [32])ray;
      auVar118 = *(undefined1 (*) [32])(ray + 0x20);
      auVar179 = *(undefined1 (*) [32])(ray + 0x40);
      local_1680 = vsubps_avx(local_15a0,auVar186);
      local_1720 = vsubps_avx(local_15c0,auVar118);
      local_1520 = vsubps_avx(local_15e0,auVar179);
      auVar181 = vsubps_avx(local_1000,auVar186);
      auVar263 = vsubps_avx(local_fc0,auVar118);
      auVar264 = vsubps_avx(local_fe0,auVar179);
      auVar186 = vsubps_avx(auVar277,auVar186);
      auVar118 = vsubps_avx(_local_1740,auVar118);
      auVar179 = vsubps_avx(auVar180,auVar179);
      local_1540 = vsubps_avx(auVar186,local_1680);
      local_1560 = vsubps_avx(auVar118,local_1720);
      local_1580 = vsubps_avx(auVar179,local_1520);
      fVar316 = local_1720._0_4_;
      fVar143 = fVar316 + auVar118._0_4_;
      fVar320 = local_1720._4_4_;
      fVar252 = fVar320 + auVar118._4_4_;
      fVar323 = local_1720._8_4_;
      fVar235 = fVar323 + auVar118._8_4_;
      fVar325 = local_1720._12_4_;
      fVar257 = fVar325 + auVar118._12_4_;
      fVar327 = local_1720._16_4_;
      fVar280 = fVar327 + auVar118._16_4_;
      fVar329 = local_1720._20_4_;
      fVar285 = fVar329 + auVar118._20_4_;
      fVar330 = local_1720._24_4_;
      fVar261 = fVar330 + auVar118._24_4_;
      fVar239 = local_1520._0_4_;
      fVar237 = auVar179._0_4_ + fVar239;
      fVar255 = local_1520._4_4_;
      fVar271 = auVar179._4_4_ + fVar255;
      fVar258 = local_1520._8_4_;
      fVar284 = auVar179._8_4_ + fVar258;
      fVar260 = local_1520._12_4_;
      fVar266 = auVar179._12_4_ + fVar260;
      fVar224 = local_1520._16_4_;
      fVar267 = auVar179._16_4_ + fVar224;
      fVar133 = local_1520._20_4_;
      fVar268 = auVar179._20_4_ + fVar133;
      fVar137 = local_1520._24_4_;
      fVar269 = auVar179._24_4_ + fVar137;
      fVar229 = local_1520._28_4_;
      fVar270 = auVar179._28_4_ + fVar229;
      fVar132 = local_1580._0_4_;
      fVar233 = local_1580._4_4_;
      auVar95._4_4_ = fVar252 * fVar233;
      auVar95._0_4_ = fVar143 * fVar132;
      fVar10 = local_1580._8_4_;
      auVar95._8_4_ = fVar235 * fVar10;
      fVar13 = local_1580._12_4_;
      auVar95._12_4_ = fVar257 * fVar13;
      fVar282 = local_1580._16_4_;
      auVar95._16_4_ = fVar280 * fVar282;
      fVar286 = local_1580._20_4_;
      auVar95._20_4_ = fVar285 * fVar286;
      fVar14 = local_1580._24_4_;
      auVar95._24_4_ = fVar261 * fVar14;
      auVar95._28_4_ = uVar100;
      fVar231 = local_1560._0_4_;
      auVar279._0_4_ = fVar237 * fVar231;
      fVar142 = local_1560._4_4_;
      auVar279._4_4_ = fVar271 * fVar142;
      fVar11 = local_1560._8_4_;
      auVar279._8_4_ = fVar284 * fVar11;
      fVar262 = local_1560._12_4_;
      auVar279._12_4_ = fVar266 * fVar262;
      fVar283 = local_1560._16_4_;
      auVar279._16_4_ = fVar267 * fVar283;
      fVar12 = local_1560._20_4_;
      auVar279._20_4_ = fVar268 * fVar12;
      fVar15 = local_1560._24_4_;
      auVar279._28_36_ = auVar305._28_36_;
      auVar279._24_4_ = fVar269 * fVar15;
      auVar180 = vsubps_avx(auVar279._0_32_,auVar95);
      fVar251 = local_1680._0_4_;
      fVar273 = auVar186._0_4_ + fVar251;
      fVar256 = local_1680._4_4_;
      fVar289 = auVar186._4_4_ + fVar256;
      fVar259 = local_1680._8_4_;
      fVar291 = auVar186._8_4_ + fVar259;
      fVar172 = local_1680._12_4_;
      fVar293 = auVar186._12_4_ + fVar172;
      fVar131 = local_1680._16_4_;
      fVar295 = auVar186._16_4_ + fVar131;
      fVar227 = local_1680._20_4_;
      fVar297 = auVar186._20_4_ + fVar227;
      fVar139 = local_1680._24_4_;
      fVar299 = auVar186._24_4_ + fVar139;
      fVar136 = local_1540._0_4_;
      fVar144 = local_1540._4_4_;
      auVar55._4_4_ = fVar271 * fVar144;
      auVar55._0_4_ = fVar237 * fVar136;
      fVar237 = local_1540._8_4_;
      auVar55._8_4_ = fVar284 * fVar237;
      fVar271 = local_1540._12_4_;
      auVar55._12_4_ = fVar266 * fVar271;
      fVar284 = local_1540._16_4_;
      auVar55._16_4_ = fVar267 * fVar284;
      fVar266 = local_1540._20_4_;
      auVar55._20_4_ = fVar268 * fVar266;
      fVar267 = local_1540._24_4_;
      auVar55._24_4_ = fVar269 * fVar267;
      auVar55._28_4_ = fVar270;
      auVar56._4_4_ = fVar289 * fVar233;
      auVar56._0_4_ = fVar273 * fVar132;
      auVar56._8_4_ = fVar291 * fVar10;
      auVar56._12_4_ = fVar293 * fVar13;
      auVar56._16_4_ = fVar295 * fVar282;
      auVar56._20_4_ = fVar297 * fVar286;
      auVar56._24_4_ = fVar299 * fVar14;
      auVar56._28_4_ = local_1580._28_4_;
      auVar275 = vsubps_avx(auVar56,auVar55);
      auVar57._4_4_ = fVar289 * fVar142;
      auVar57._0_4_ = fVar273 * fVar231;
      auVar57._8_4_ = fVar291 * fVar11;
      auVar57._12_4_ = fVar293 * fVar262;
      auVar57._16_4_ = fVar295 * fVar283;
      auVar57._20_4_ = fVar297 * fVar12;
      auVar57._24_4_ = fVar299 * fVar15;
      auVar57._28_4_ = fVar270;
      auVar58._4_4_ = fVar252 * fVar144;
      auVar58._0_4_ = fVar143 * fVar136;
      auVar58._8_4_ = fVar235 * fVar237;
      auVar58._12_4_ = fVar257 * fVar271;
      auVar58._16_4_ = fVar280 * fVar284;
      auVar58._20_4_ = fVar285 * fVar266;
      auVar58._24_4_ = fVar261 * fVar267;
      auVar58._28_4_ = local_1720._28_4_ + auVar118._28_4_;
      auVar151 = vsubps_avx(auVar58,auVar57);
      fVar269 = *(float *)(ray + 0xc0);
      fVar270 = *(float *)(ray + 0xc4);
      fVar273 = *(float *)(ray + 200);
      fVar289 = *(float *)(ray + 0xcc);
      fVar291 = *(float *)(ray + 0xd0);
      fVar293 = *(float *)(ray + 0xd4);
      fVar295 = *(float *)(ray + 0xd8);
      auVar93 = *(undefined1 (*) [28])(ray + 0xc0);
      pRVar99 = ray + 0xa0;
      fVar297 = *(float *)pRVar99;
      fVar299 = *(float *)(ray + 0xa4);
      fVar301 = *(float *)(ray + 0xa8);
      fVar145 = *(float *)(ray + 0xac);
      fVar162 = *(float *)(ray + 0xb0);
      fVar164 = *(float *)(ray + 0xb4);
      fVar166 = *(float *)(ray + 0xb8);
      auVar94 = *(undefined1 (*) [28])pRVar99;
      auVar288 = *(undefined1 (*) [32])pRVar99;
      fVar195 = auVar275._28_4_ + local_1540._28_4_;
      fVar168 = *(float *)(ray + 0x80);
      fVar170 = *(float *)(ray + 0x84);
      fVar171 = *(float *)(ray + 0x88);
      fVar174 = *(float *)(ray + 0x8c);
      fVar189 = *(float *)(ray + 0x90);
      fVar191 = *(float *)(ray + 0x94);
      fVar193 = *(float *)(ray + 0x98);
      auVar96 = *(undefined1 (*) [28])(ray + 0x80);
      fVar240 = fVar168 * auVar180._0_4_ + auVar275._0_4_ * fVar297 + auVar151._0_4_ * fVar269;
      fVar253 = fVar170 * auVar180._4_4_ + auVar275._4_4_ * fVar299 + auVar151._4_4_ * fVar270;
      auVar242._0_8_ = CONCAT44(fVar253,fVar240);
      auVar242._8_4_ =
           fVar171 * auVar180._8_4_ + auVar275._8_4_ * fVar301 + auVar151._8_4_ * fVar273;
      auVar242._12_4_ =
           fVar174 * auVar180._12_4_ + auVar275._12_4_ * fVar145 + auVar151._12_4_ * fVar289;
      auVar244._16_4_ =
           fVar189 * auVar180._16_4_ + auVar275._16_4_ * fVar162 + auVar151._16_4_ * fVar291;
      auVar244._0_16_ = auVar242;
      auVar244._20_4_ =
           fVar191 * auVar180._20_4_ + auVar275._20_4_ * fVar164 + auVar151._20_4_ * fVar293;
      auVar248._24_4_ =
           fVar193 * auVar180._24_4_ + auVar275._24_4_ * fVar166 + auVar151._24_4_ * fVar295;
      auVar248._0_24_ = auVar244;
      auVar248._28_4_ = auVar180._28_4_ + fVar195;
      local_15a0 = vsubps_avx(local_1720,auVar263);
      auVar180 = vsubps_avx(local_1520,auVar264);
      fVar317 = fVar316 + auVar263._0_4_;
      fVar321 = fVar320 + auVar263._4_4_;
      fVar324 = fVar323 + auVar263._8_4_;
      fVar326 = fVar325 + auVar263._12_4_;
      fVar328 = fVar327 + auVar263._16_4_;
      fVar302 = fVar329 + auVar263._20_4_;
      fVar306 = fVar330 + auVar263._24_4_;
      fVar143 = auVar263._28_4_;
      fVar197 = fVar239 + auVar264._0_4_;
      fVar163 = fVar255 + auVar264._4_4_;
      fVar165 = fVar258 + auVar264._8_4_;
      fVar167 = fVar260 + auVar264._12_4_;
      fVar169 = fVar224 + auVar264._16_4_;
      fVar272 = fVar133 + auVar264._20_4_;
      fVar281 = fVar137 + auVar264._24_4_;
      fVar252 = auVar180._0_4_;
      fVar235 = auVar180._4_4_;
      auVar59._4_4_ = fVar321 * fVar235;
      auVar59._0_4_ = fVar317 * fVar252;
      fVar257 = auVar180._8_4_;
      auVar59._8_4_ = fVar324 * fVar257;
      fVar280 = auVar180._12_4_;
      auVar59._12_4_ = fVar326 * fVar280;
      fVar285 = auVar180._16_4_;
      auVar59._16_4_ = fVar328 * fVar285;
      fVar261 = auVar180._20_4_;
      auVar59._20_4_ = fVar302 * fVar261;
      fVar268 = auVar180._24_4_;
      auVar59._24_4_ = fVar306 * fVar268;
      auVar59._28_4_ = fVar195;
      fVar195 = local_15a0._0_4_;
      fVar199 = local_15a0._4_4_;
      auVar60._4_4_ = fVar199 * fVar163;
      auVar60._0_4_ = fVar195 * fVar197;
      fVar134 = local_15a0._8_4_;
      auVar60._8_4_ = fVar134 * fVar165;
      fVar135 = local_15a0._12_4_;
      auVar60._12_4_ = fVar135 * fVar167;
      fVar138 = local_15a0._16_4_;
      auVar60._16_4_ = fVar138 * fVar169;
      fVar140 = local_15a0._20_4_;
      auVar60._20_4_ = fVar140 * fVar272;
      fVar141 = local_15a0._24_4_;
      auVar60._24_4_ = fVar141 * fVar281;
      auVar60._28_4_ = fVar229;
      auVar180 = vsubps_avx(auVar60,auVar59);
      auVar275 = vsubps_avx(local_1680,auVar181);
      fVar307 = auVar275._0_4_;
      fVar309 = auVar275._4_4_;
      auVar61._4_4_ = fVar309 * fVar163;
      auVar61._0_4_ = fVar307 * fVar197;
      fVar310 = auVar275._8_4_;
      auVar61._8_4_ = fVar310 * fVar165;
      fVar311 = auVar275._12_4_;
      auVar61._12_4_ = fVar311 * fVar167;
      fVar312 = auVar275._16_4_;
      auVar61._16_4_ = fVar312 * fVar169;
      fVar313 = auVar275._20_4_;
      auVar61._20_4_ = fVar313 * fVar272;
      fVar314 = auVar275._24_4_;
      auVar61._24_4_ = fVar314 * fVar281;
      auVar61._28_4_ = fVar229 + auVar264._28_4_;
      fVar197 = fVar251 + auVar181._0_4_;
      fVar163 = fVar256 + auVar181._4_4_;
      fVar165 = fVar259 + auVar181._8_4_;
      fVar167 = fVar172 + auVar181._12_4_;
      fVar169 = fVar131 + auVar181._16_4_;
      fVar272 = fVar227 + auVar181._20_4_;
      fVar281 = fVar139 + auVar181._24_4_;
      fVar229 = auVar181._28_4_;
      auVar62._4_4_ = fVar235 * fVar163;
      auVar62._0_4_ = fVar252 * fVar197;
      auVar62._8_4_ = fVar257 * fVar165;
      auVar62._12_4_ = fVar280 * fVar167;
      auVar62._16_4_ = fVar285 * fVar169;
      auVar62._20_4_ = fVar261 * fVar272;
      auVar62._24_4_ = fVar268 * fVar281;
      auVar62._28_4_ = auVar248._28_4_;
      auVar275 = vsubps_avx(auVar62,auVar61);
      auVar63._4_4_ = fVar163 * fVar199;
      auVar63._0_4_ = fVar197 * fVar195;
      auVar63._8_4_ = fVar165 * fVar134;
      auVar63._12_4_ = fVar167 * fVar135;
      auVar63._16_4_ = fVar169 * fVar138;
      auVar63._20_4_ = fVar272 * fVar140;
      auVar63._24_4_ = fVar281 * fVar141;
      auVar63._28_4_ = local_1680._28_4_ + fVar229;
      auVar64._4_4_ = fVar309 * fVar321;
      auVar64._0_4_ = fVar307 * fVar317;
      auVar64._8_4_ = fVar310 * fVar324;
      auVar64._12_4_ = fVar311 * fVar326;
      auVar64._16_4_ = fVar312 * fVar328;
      auVar64._20_4_ = fVar313 * fVar302;
      auVar64._24_4_ = fVar314 * fVar306;
      auVar64._28_4_ = auVar248._28_4_;
      auVar151 = vsubps_avx(auVar64,auVar63);
      fVar241 = fVar168 * auVar180._0_4_ + fVar269 * auVar151._0_4_ + fVar297 * auVar275._0_4_;
      fVar254 = fVar170 * auVar180._4_4_ + fVar270 * auVar151._4_4_ + fVar299 * auVar275._4_4_;
      auVar243._0_8_ = CONCAT44(fVar254,fVar241);
      auVar243._8_4_ =
           fVar171 * auVar180._8_4_ + fVar273 * auVar151._8_4_ + fVar301 * auVar275._8_4_;
      auVar243._12_4_ =
           fVar174 * auVar180._12_4_ + fVar289 * auVar151._12_4_ + fVar145 * auVar275._12_4_;
      auVar245._16_4_ =
           fVar189 * auVar180._16_4_ + fVar291 * auVar151._16_4_ + fVar162 * auVar275._16_4_;
      auVar245._0_16_ = auVar243;
      auVar245._20_4_ =
           fVar191 * auVar180._20_4_ + fVar293 * auVar151._20_4_ + fVar164 * auVar275._20_4_;
      auVar249._24_4_ =
           fVar193 * auVar180._24_4_ + fVar295 * auVar151._24_4_ + fVar166 * auVar275._24_4_;
      auVar249._0_24_ = auVar245;
      auVar249._28_4_ = auVar180._28_4_ + auVar151._28_4_ + auVar275._28_4_;
      auVar180 = vsubps_avx(auVar181,auVar186);
      fVar317 = auVar186._0_4_ + auVar181._0_4_;
      fVar321 = auVar186._4_4_ + auVar181._4_4_;
      fVar324 = auVar186._8_4_ + auVar181._8_4_;
      fVar326 = auVar186._12_4_ + auVar181._12_4_;
      fVar328 = auVar186._16_4_ + auVar181._16_4_;
      fVar302 = auVar186._20_4_ + auVar181._20_4_;
      fVar306 = auVar186._24_4_ + auVar181._24_4_;
      fVar173 = auVar186._28_4_ + fVar229;
      auVar181 = vsubps_avx(auVar263,auVar118);
      fVar197 = auVar263._0_4_ + auVar118._0_4_;
      fVar163 = auVar263._4_4_ + auVar118._4_4_;
      fVar165 = auVar263._8_4_ + auVar118._8_4_;
      fVar167 = auVar263._12_4_ + auVar118._12_4_;
      fVar169 = auVar263._16_4_ + auVar118._16_4_;
      fVar272 = auVar263._20_4_ + auVar118._20_4_;
      fVar281 = auVar263._24_4_ + auVar118._24_4_;
      auVar186 = vsubps_avx(auVar264,auVar179);
      fVar175 = auVar264._0_4_ + auVar179._0_4_;
      fVar190 = auVar264._4_4_ + auVar179._4_4_;
      fVar192 = auVar264._8_4_ + auVar179._8_4_;
      fVar194 = auVar264._12_4_ + auVar179._12_4_;
      fVar196 = auVar264._16_4_ + auVar179._16_4_;
      fVar198 = auVar264._20_4_ + auVar179._20_4_;
      fVar200 = auVar264._24_4_ + auVar179._24_4_;
      fVar287 = auVar186._0_4_;
      fVar290 = auVar186._4_4_;
      auVar65._4_4_ = fVar290 * fVar163;
      auVar65._0_4_ = fVar287 * fVar197;
      fVar292 = auVar186._8_4_;
      auVar65._8_4_ = fVar292 * fVar165;
      fVar294 = auVar186._12_4_;
      auVar65._12_4_ = fVar294 * fVar167;
      fVar296 = auVar186._16_4_;
      auVar65._16_4_ = fVar296 * fVar169;
      fVar298 = auVar186._20_4_;
      auVar65._20_4_ = fVar298 * fVar272;
      fVar300 = auVar186._24_4_;
      auVar65._24_4_ = fVar300 * fVar281;
      auVar65._28_4_ = fVar229;
      fVar225 = auVar181._0_4_;
      fVar228 = auVar181._4_4_;
      auVar66._4_4_ = fVar228 * fVar190;
      auVar66._0_4_ = fVar225 * fVar175;
      fVar230 = auVar181._8_4_;
      auVar66._8_4_ = fVar230 * fVar192;
      fVar232 = auVar181._12_4_;
      auVar66._12_4_ = fVar232 * fVar194;
      fVar234 = auVar181._16_4_;
      auVar66._16_4_ = fVar234 * fVar196;
      fVar236 = auVar181._20_4_;
      auVar66._20_4_ = fVar236 * fVar198;
      fVar238 = auVar181._24_4_;
      auVar66._24_4_ = fVar238 * fVar200;
      auVar66._28_4_ = fVar143;
      auVar186 = vsubps_avx(auVar66,auVar65);
      fVar318 = auVar180._0_4_;
      fVar322 = auVar180._4_4_;
      auVar67._4_4_ = fVar322 * fVar190;
      auVar67._0_4_ = fVar318 * fVar175;
      fVar175 = auVar180._8_4_;
      auVar67._8_4_ = fVar175 * fVar192;
      fVar190 = auVar180._12_4_;
      auVar67._12_4_ = fVar190 * fVar194;
      fVar192 = auVar180._16_4_;
      auVar67._16_4_ = fVar192 * fVar196;
      fVar194 = auVar180._20_4_;
      auVar67._20_4_ = fVar194 * fVar198;
      fVar196 = auVar180._24_4_;
      auVar67._24_4_ = fVar196 * fVar200;
      auVar67._28_4_ = auVar264._28_4_ + auVar179._28_4_;
      auVar68._4_4_ = fVar290 * fVar321;
      auVar68._0_4_ = fVar287 * fVar317;
      auVar68._8_4_ = fVar292 * fVar324;
      auVar68._12_4_ = fVar294 * fVar326;
      auVar68._16_4_ = fVar296 * fVar328;
      auVar68._20_4_ = fVar298 * fVar302;
      auVar68._24_4_ = fVar300 * fVar306;
      auVar68._28_4_ = fVar143;
      auVar179 = vsubps_avx(auVar68,auVar67);
      auVar69._4_4_ = fVar321 * fVar228;
      auVar69._0_4_ = fVar317 * fVar225;
      auVar69._8_4_ = fVar324 * fVar230;
      auVar69._12_4_ = fVar326 * fVar232;
      auVar69._16_4_ = fVar328 * fVar234;
      auVar69._20_4_ = fVar302 * fVar236;
      auVar69._24_4_ = fVar306 * fVar238;
      auVar69._28_4_ = fVar173;
      auVar70._4_4_ = fVar322 * fVar163;
      auVar70._0_4_ = fVar318 * fVar197;
      auVar70._8_4_ = fVar175 * fVar165;
      auVar70._12_4_ = fVar190 * fVar167;
      auVar70._16_4_ = fVar192 * fVar169;
      auVar70._20_4_ = fVar194 * fVar272;
      auVar70._24_4_ = fVar196 * fVar281;
      auVar70._28_4_ = fVar143 + auVar118._28_4_;
      auVar118 = vsubps_avx(auVar70,auVar69);
      auVar124._0_4_ =
           fVar168 * auVar186._0_4_ + fVar269 * auVar118._0_4_ + fVar297 * auVar179._0_4_;
      auVar124._4_4_ =
           fVar170 * auVar186._4_4_ + fVar270 * auVar118._4_4_ + fVar299 * auVar179._4_4_;
      auVar124._8_4_ =
           fVar171 * auVar186._8_4_ + fVar273 * auVar118._8_4_ + fVar301 * auVar179._8_4_;
      auVar124._12_4_ =
           fVar174 * auVar186._12_4_ + fVar289 * auVar118._12_4_ + fVar145 * auVar179._12_4_;
      auVar124._16_4_ =
           fVar189 * auVar186._16_4_ + fVar291 * auVar118._16_4_ + fVar162 * auVar179._16_4_;
      auVar124._20_4_ =
           fVar191 * auVar186._20_4_ + fVar293 * auVar118._20_4_ + fVar164 * auVar179._20_4_;
      auVar124._24_4_ =
           fVar193 * auVar186._24_4_ + fVar295 * auVar118._24_4_ + fVar166 * auVar179._24_4_;
      auVar124._28_4_ = fVar173 + auVar118._28_4_ + fVar173;
      auVar278._0_4_ = auVar124._0_4_ + fVar240 + fVar241;
      auVar278._4_4_ = auVar124._4_4_ + fVar253 + fVar254;
      auVar278._8_4_ = auVar124._8_4_ + auVar242._8_4_ + auVar243._8_4_;
      auVar278._12_4_ = auVar124._12_4_ + auVar242._12_4_ + auVar243._12_4_;
      auVar278._16_4_ = auVar124._16_4_ + auVar244._16_4_ + auVar245._16_4_;
      auVar278._20_4_ = auVar124._20_4_ + auVar244._20_4_ + auVar245._20_4_;
      auVar278._24_4_ = auVar124._24_4_ + auVar248._24_4_ + auVar249._24_4_;
      auVar278._28_4_ = auVar124._28_4_ + auVar248._28_4_ + auVar249._28_4_;
      auVar226._8_4_ = 0x7fffffff;
      auVar226._0_8_ = 0x7fffffff7fffffff;
      auVar226._12_4_ = 0x7fffffff;
      auVar226._16_4_ = 0x7fffffff;
      auVar226._20_4_ = 0x7fffffff;
      auVar226._24_4_ = 0x7fffffff;
      auVar226._28_4_ = 0x7fffffff;
      auVar186 = vandps_avx(auVar278,auVar226);
      fVar229 = auVar186._0_4_ * 1.1920929e-07;
      fVar143 = auVar186._4_4_ * 1.1920929e-07;
      auVar71._4_4_ = fVar143;
      auVar71._0_4_ = fVar229;
      fVar269 = auVar186._8_4_ * 1.1920929e-07;
      auVar71._8_4_ = fVar269;
      fVar270 = auVar186._12_4_ * 1.1920929e-07;
      auVar71._12_4_ = fVar270;
      fVar273 = auVar186._16_4_ * 1.1920929e-07;
      auVar71._16_4_ = fVar273;
      fVar289 = auVar186._20_4_ * 1.1920929e-07;
      auVar71._20_4_ = fVar289;
      fVar291 = auVar186._24_4_ * 1.1920929e-07;
      auVar71._24_4_ = fVar291;
      auVar71._28_4_ = auVar186._28_4_;
      auVar118 = vminps_avx(auVar248,auVar249);
      auVar118 = vminps_avx(auVar118,auVar124);
      auVar207._0_8_ = CONCAT44(fVar143,fVar229) ^ 0x8000000080000000;
      auVar207._8_4_ = -fVar269;
      auVar207._12_4_ = -fVar270;
      auVar207._16_4_ = -fVar273;
      auVar207._20_4_ = -fVar289;
      auVar207._24_4_ = -fVar291;
      auVar207._28_4_ = auVar186._28_4_ ^ 0x80000000;
      auVar118 = vcmpps_avx(auVar118,auVar207,5);
      auVar179 = vmaxps_avx(auVar248,auVar249);
      auVar186 = vmaxps_avx(auVar179,auVar124);
      auVar186 = vcmpps_avx(auVar186,auVar71,2);
      auVar180 = vorps_avx(auVar118,auVar186);
      auVar263 = local_1860 & auVar180;
      auVar186 = vandps_avx(auVar180,local_1860);
      if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar263 >> 0x7f,0) != '\0') ||
            (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar263 >> 0xbf,0) != '\0') ||
          (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar263[0x1f] < '\0') {
        auVar72._4_4_ = fVar199 * fVar233;
        auVar72._0_4_ = fVar195 * fVar132;
        auVar72._8_4_ = fVar134 * fVar10;
        auVar72._12_4_ = fVar135 * fVar13;
        auVar72._16_4_ = fVar138 * fVar282;
        auVar72._20_4_ = fVar140 * fVar286;
        auVar72._24_4_ = fVar141 * fVar14;
        auVar72._28_4_ = auVar180._28_4_;
        auVar73._4_4_ = fVar235 * fVar142;
        auVar73._0_4_ = fVar252 * fVar231;
        auVar73._8_4_ = fVar257 * fVar11;
        auVar73._12_4_ = fVar280 * fVar262;
        auVar73._16_4_ = fVar285 * fVar283;
        auVar73._20_4_ = fVar261 * fVar12;
        auVar73._24_4_ = fVar268 * fVar15;
        auVar73._28_4_ = local_1860._28_4_;
        auVar263 = vsubps_avx(auVar73,auVar72);
        auVar74._4_4_ = fVar235 * fVar228;
        auVar74._0_4_ = fVar252 * fVar225;
        auVar74._8_4_ = fVar257 * fVar230;
        auVar74._12_4_ = fVar280 * fVar232;
        auVar74._16_4_ = fVar285 * fVar234;
        auVar74._20_4_ = fVar261 * fVar236;
        auVar74._24_4_ = fVar268 * fVar238;
        auVar74._28_4_ = auVar118._28_4_;
        auVar75._4_4_ = fVar199 * fVar290;
        auVar75._0_4_ = fVar195 * fVar287;
        auVar75._8_4_ = fVar134 * fVar292;
        auVar75._12_4_ = fVar135 * fVar294;
        auVar75._16_4_ = fVar138 * fVar296;
        auVar75._20_4_ = fVar140 * fVar298;
        auVar75._24_4_ = fVar141 * fVar300;
        auVar75._28_4_ = auVar179._28_4_;
        auVar180 = vsubps_avx(auVar75,auVar74);
        auVar118 = vandps_avx(auVar72,auVar226);
        auVar179 = vandps_avx(auVar74,auVar226);
        auVar118 = vcmpps_avx(auVar118,auVar179,1);
        auVar180 = vblendvps_avx(auVar180,auVar263,auVar118);
        auVar76._4_4_ = fVar309 * fVar290;
        auVar76._0_4_ = fVar307 * fVar287;
        auVar76._8_4_ = fVar310 * fVar292;
        auVar76._12_4_ = fVar311 * fVar294;
        auVar76._16_4_ = fVar312 * fVar296;
        auVar76._20_4_ = fVar313 * fVar298;
        auVar76._24_4_ = fVar314 * fVar300;
        auVar76._28_4_ = auVar118._28_4_;
        auVar77._4_4_ = fVar309 * fVar233;
        auVar77._0_4_ = fVar307 * fVar132;
        auVar77._8_4_ = fVar310 * fVar10;
        auVar77._12_4_ = fVar311 * fVar13;
        auVar77._16_4_ = fVar312 * fVar282;
        auVar77._20_4_ = fVar313 * fVar286;
        auVar77._24_4_ = fVar314 * fVar14;
        auVar77._28_4_ = auVar263._28_4_;
        auVar78._4_4_ = fVar235 * fVar144;
        auVar78._0_4_ = fVar252 * fVar136;
        auVar78._8_4_ = fVar257 * fVar237;
        auVar78._12_4_ = fVar280 * fVar271;
        auVar78._16_4_ = fVar285 * fVar284;
        auVar78._20_4_ = fVar261 * fVar266;
        auVar78._24_4_ = fVar268 * fVar267;
        auVar78._28_4_ = auVar179._28_4_;
        auVar263 = vsubps_avx(auVar77,auVar78);
        auVar79._4_4_ = fVar322 * fVar235;
        auVar79._0_4_ = fVar318 * fVar252;
        auVar79._8_4_ = fVar175 * fVar257;
        auVar79._12_4_ = fVar190 * fVar280;
        auVar79._16_4_ = fVar192 * fVar285;
        auVar79._20_4_ = fVar194 * fVar261;
        auVar79._24_4_ = fVar196 * fVar268;
        auVar79._28_4_ = auVar181._28_4_;
        auVar181 = vsubps_avx(auVar79,auVar76);
        auVar118 = vandps_avx(auVar78,auVar226);
        auVar179 = vandps_avx(auVar76,auVar226);
        auVar179 = vcmpps_avx(auVar118,auVar179,1);
        auVar181 = vblendvps_avx(auVar181,auVar263,auVar179);
        auVar80._4_4_ = fVar322 * fVar199;
        auVar80._0_4_ = fVar318 * fVar195;
        auVar80._8_4_ = fVar175 * fVar134;
        auVar80._12_4_ = fVar190 * fVar135;
        auVar80._16_4_ = fVar192 * fVar138;
        auVar80._20_4_ = fVar194 * fVar140;
        auVar80._24_4_ = fVar196 * fVar141;
        auVar80._28_4_ = auVar179._28_4_;
        auVar81._4_4_ = fVar199 * fVar144;
        auVar81._0_4_ = fVar195 * fVar136;
        auVar81._8_4_ = fVar134 * fVar237;
        auVar81._12_4_ = fVar135 * fVar271;
        auVar81._16_4_ = fVar138 * fVar284;
        auVar81._20_4_ = fVar140 * fVar266;
        auVar81._24_4_ = fVar141 * fVar267;
        auVar81._28_4_ = auVar263._28_4_;
        auVar82._4_4_ = fVar309 * fVar142;
        auVar82._0_4_ = fVar307 * fVar231;
        auVar82._8_4_ = fVar310 * fVar11;
        auVar82._12_4_ = fVar311 * fVar262;
        auVar82._16_4_ = fVar312 * fVar283;
        auVar82._20_4_ = fVar313 * fVar12;
        auVar82._24_4_ = fVar314 * fVar15;
        auVar82._28_4_ = auVar118._28_4_;
        auVar83._4_4_ = fVar309 * fVar228;
        auVar83._0_4_ = fVar307 * fVar225;
        auVar83._8_4_ = fVar310 * fVar230;
        auVar83._12_4_ = fVar311 * fVar232;
        auVar83._16_4_ = fVar312 * fVar234;
        auVar83._20_4_ = fVar313 * fVar236;
        auVar83._24_4_ = fVar314 * fVar238;
        auVar83._28_4_ = local_1540._28_4_;
        auVar264 = vsubps_avx(auVar81,auVar82);
        auVar275 = vsubps_avx(auVar83,auVar80);
        auVar118 = vandps_avx(auVar82,auVar226);
        auVar179 = vandps_avx(auVar80,auVar226);
        auVar263 = vcmpps_avx(auVar118,auVar179,1);
        auVar179 = vblendvps_avx(auVar275,auVar264,auVar263);
        local_18e0 = auVar93._0_4_;
        fStack_18dc = auVar93._4_4_;
        fStack_18d8 = auVar93._8_4_;
        fStack_18d4 = auVar93._12_4_;
        fStack_18d0 = auVar93._16_4_;
        fStack_18cc = auVar93._20_4_;
        fStack_18c8 = auVar93._24_4_;
        local_1740._0_4_ = auVar94._0_4_;
        local_1740._4_4_ = auVar94._4_4_;
        fStack_1738 = auVar94._8_4_;
        fStack_1734 = auVar94._12_4_;
        fStack_1730 = auVar94._16_4_;
        fStack_172c = auVar94._20_4_;
        fStack_1728 = auVar94._24_4_;
        fVar229 = auVar264._28_4_;
        local_18c0 = auVar96._0_4_;
        fStack_18bc = auVar96._4_4_;
        fStack_18b8 = auVar96._8_4_;
        fStack_18b4 = auVar96._12_4_;
        fStack_18b0 = auVar96._16_4_;
        fStack_18ac = auVar96._20_4_;
        fStack_18a8 = auVar96._24_4_;
        fVar143 = auVar180._0_4_ * local_18c0 +
                  auVar179._0_4_ * local_18e0 + auVar181._0_4_ * (float)local_1740._0_4_;
        fVar132 = auVar180._4_4_ * fStack_18bc +
                  auVar179._4_4_ * fStack_18dc + auVar181._4_4_ * (float)local_1740._4_4_;
        fVar231 = auVar180._8_4_ * fStack_18b8 +
                  auVar179._8_4_ * fStack_18d8 + auVar181._8_4_ * fStack_1738;
        fVar136 = auVar180._12_4_ * fStack_18b4 +
                  auVar179._12_4_ * fStack_18d4 + auVar181._12_4_ * fStack_1734;
        fVar252 = auVar180._16_4_ * fStack_18b0 +
                  auVar179._16_4_ * fStack_18d0 + auVar181._16_4_ * fStack_1730;
        fVar233 = auVar180._20_4_ * fStack_18ac +
                  auVar179._20_4_ * fStack_18cc + auVar181._20_4_ * fStack_172c;
        fVar142 = auVar180._24_4_ * fStack_18a8 +
                  auVar179._24_4_ * fStack_18c8 + auVar181._24_4_ * fStack_1728;
        fVar144 = fVar229 + auVar263._28_4_ + fVar229;
        auVar125._0_4_ = fVar143 + fVar143;
        auVar125._4_4_ = fVar132 + fVar132;
        auVar125._8_4_ = fVar231 + fVar231;
        auVar125._12_4_ = fVar136 + fVar136;
        auVar125._16_4_ = fVar252 + fVar252;
        auVar125._20_4_ = fVar233 + fVar233;
        auVar125._24_4_ = fVar142 + fVar142;
        auVar125._28_4_ = fVar144 + fVar144;
        fVar143 = auVar180._0_4_ * fVar251 + auVar179._0_4_ * fVar239 + auVar181._0_4_ * fVar316;
        fVar132 = auVar180._4_4_ * fVar256 + auVar179._4_4_ * fVar255 + auVar181._4_4_ * fVar320;
        fVar231 = auVar180._8_4_ * fVar259 + auVar179._8_4_ * fVar258 + auVar181._8_4_ * fVar323;
        fVar172 = auVar180._12_4_ * fVar172 + auVar179._12_4_ * fVar260 + auVar181._12_4_ * fVar325;
        fVar224 = auVar180._16_4_ * fVar131 + auVar179._16_4_ * fVar224 + auVar181._16_4_ * fVar327;
        fVar131 = auVar180._20_4_ * fVar227 + auVar179._20_4_ * fVar133 + auVar181._20_4_ * fVar329;
        fVar133 = auVar180._24_4_ * fVar139 + auVar179._24_4_ * fVar137 + auVar181._24_4_ * fVar330;
        fVar227 = auVar118._28_4_ + fVar229 + auVar118._28_4_;
        auVar118 = vrcpps_avx(auVar125);
        fVar239 = auVar118._0_4_;
        fVar251 = auVar118._4_4_;
        auVar84._4_4_ = auVar125._4_4_ * fVar251;
        auVar84._0_4_ = auVar125._0_4_ * fVar239;
        fVar255 = auVar118._8_4_;
        auVar84._8_4_ = auVar125._8_4_ * fVar255;
        fVar256 = auVar118._12_4_;
        auVar84._12_4_ = auVar125._12_4_ * fVar256;
        fVar258 = auVar118._16_4_;
        auVar84._16_4_ = auVar125._16_4_ * fVar258;
        fVar259 = auVar118._20_4_;
        auVar84._20_4_ = auVar125._20_4_ * fVar259;
        fVar260 = auVar118._24_4_;
        auVar84._24_4_ = auVar125._24_4_ * fVar260;
        auVar84._28_4_ = local_1560._28_4_;
        auVar250._8_4_ = 0x3f800000;
        auVar250._0_8_ = &DAT_3f8000003f800000;
        auVar250._12_4_ = 0x3f800000;
        auVar250._16_4_ = 0x3f800000;
        auVar250._20_4_ = 0x3f800000;
        auVar250._24_4_ = 0x3f800000;
        auVar250._28_4_ = 0x3f800000;
        auVar118 = vsubps_avx(auVar250,auVar84);
        auVar85._4_4_ = (fVar132 + fVar132) * (fVar251 + fVar251 * auVar118._4_4_);
        auVar85._0_4_ = (fVar143 + fVar143) * (fVar239 + fVar239 * auVar118._0_4_);
        auVar85._8_4_ = (fVar231 + fVar231) * (fVar255 + fVar255 * auVar118._8_4_);
        auVar85._12_4_ = (fVar172 + fVar172) * (fVar256 + fVar256 * auVar118._12_4_);
        auVar85._16_4_ = (fVar224 + fVar224) * (fVar258 + fVar258 * auVar118._16_4_);
        auVar85._20_4_ = (fVar131 + fVar131) * (fVar259 + fVar259 * auVar118._20_4_);
        auVar85._24_4_ = (fVar133 + fVar133) * (fVar260 + fVar260 * auVar118._24_4_);
        auVar85._28_4_ = fVar227 + fVar227;
        auVar118 = vcmpps_avx(auVar85,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar263 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar85,2);
        auVar118 = vandps_avx(auVar263,auVar118);
        auVar263 = vcmpps_avx(auVar125,_DAT_02020f00,4);
        auVar118 = vandps_avx(auVar263,auVar118);
        auVar178 = vpslld_avx(auVar118._0_16_,0x1f);
        auVar201 = vpsrad_avx(auVar178,0x1f);
        auVar178 = vpslld_avx(auVar118._16_16_,0x1f);
        auVar178 = vpsrad_avx(auVar178,0x1f);
        auVar126._16_16_ = auVar178;
        auVar126._0_16_ = auVar201;
        auVar118 = auVar186 & auVar126;
        auVar186 = vandps_avx(auVar186,auVar126);
        local_15e0 = auVar249;
        if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar118 >> 0x7f,0) != '\0') ||
              (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0xbf,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar118[0x1f] < '\0') {
          local_15c0._8_8_ = auVar242._8_8_;
          local_15c0._16_8_ = auVar244._16_8_;
          local_15c0._24_8_ = auVar248._24_8_;
          local_1100 = auVar242._0_8_;
          uStack_10f8 = local_15c0._8_8_;
          uStack_10f0 = local_15c0._16_8_;
          uStack_10e8 = local_15c0._24_8_;
          local_15e0._8_8_ = auVar243._8_8_;
          local_15e0._16_8_ = auVar245._16_8_;
          local_15e0._24_8_ = auVar249._24_8_;
          local_1120 = auVar243._0_8_;
          uStack_1118 = local_15e0._8_8_;
          uStack_1110 = local_15e0._16_8_;
          uStack_1108 = local_15e0._24_8_;
          local_1140 = auVar278;
          local_1160 = auVar85;
          local_1180 = auVar180;
          local_11a0 = auVar181;
          local_11c0 = auVar179;
        }
      }
      auVar305 = ZEXT3264(local_1760);
      auVar308 = ZEXT3264(local_1780);
      auVar315 = ZEXT3264(local_17a0);
      auVar319 = ZEXT3264(local_17c0);
      pRVar99 = (RayK<8> *)(ulong)*(uint *)(local_1930 + 0x18);
      pGVar7 = (context->scene->geometries).items[(long)pRVar99].ptr;
      uVar103 = pGVar7->mask;
      auVar155._4_4_ = uVar103;
      auVar155._0_4_ = uVar103;
      auVar155._8_4_ = uVar103;
      auVar155._12_4_ = uVar103;
      auVar155._16_4_ = uVar103;
      auVar155._20_4_ = uVar103;
      auVar155._24_4_ = uVar103;
      auVar155._28_4_ = uVar103;
      auVar118 = vandps_avx(auVar155,*(undefined1 (*) [32])(ray + 0x120));
      auVar178 = vpcmpeqd_avx(auVar118._16_16_,ZEXT816(0) << 0x40);
      auVar201 = vpcmpeqd_avx(auVar118._0_16_,ZEXT816(0) << 0x40);
      auVar185._16_16_ = auVar178;
      auVar185._0_16_ = auVar186._0_16_;
      auVar118 = vblendps_avx(ZEXT1632(auVar201),auVar185,0xf0);
      auVar179 = auVar186 & ~auVar118;
      if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar179 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar179 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar179 >> 0x7f,0) != '\0') ||
            (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar179 >> 0xbf,0) != '\0') ||
          (auVar179 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar179[0x1f] < '\0') {
        local_1840._0_32_ = vandnps_avx(auVar118,auVar186);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar118 = vrcpps_avx(local_1140);
          auVar186 = vandps_avx(local_1140,auVar226);
          fVar239 = auVar118._0_4_;
          fVar251 = auVar118._4_4_;
          auVar89._4_4_ = local_1140._4_4_ * fVar251;
          auVar89._0_4_ = local_1140._0_4_ * fVar239;
          fVar255 = auVar118._8_4_;
          auVar89._8_4_ = local_1140._8_4_ * fVar255;
          fVar256 = auVar118._12_4_;
          auVar89._12_4_ = local_1140._12_4_ * fVar256;
          fVar258 = auVar118._16_4_;
          auVar89._16_4_ = local_1140._16_4_ * fVar258;
          fVar259 = auVar118._20_4_;
          auVar89._20_4_ = local_1140._20_4_ * fVar259;
          fVar260 = auVar118._24_4_;
          auVar89._24_4_ = local_1140._24_4_ * fVar260;
          auVar89._28_4_ = local_1140._28_4_;
          auVar223._8_4_ = 0x3f800000;
          auVar223._0_8_ = &DAT_3f8000003f800000;
          auVar223._12_4_ = 0x3f800000;
          auVar223._16_4_ = 0x3f800000;
          auVar223._20_4_ = 0x3f800000;
          auVar223._24_4_ = 0x3f800000;
          auVar223._28_4_ = 0x3f800000;
          auVar179 = vsubps_avx(auVar223,auVar89);
          auVar157._0_4_ = fVar239 + fVar239 * auVar179._0_4_;
          auVar157._4_4_ = fVar251 + fVar251 * auVar179._4_4_;
          auVar157._8_4_ = fVar255 + fVar255 * auVar179._8_4_;
          auVar157._12_4_ = fVar256 + fVar256 * auVar179._12_4_;
          auVar157._16_4_ = fVar258 + fVar258 * auVar179._16_4_;
          auVar157._20_4_ = fVar259 + fVar259 * auVar179._20_4_;
          auVar157._24_4_ = fVar260 + fVar260 * auVar179._24_4_;
          auVar157._28_4_ = auVar118._28_4_ + auVar179._28_4_;
          auVar211._8_4_ = 0x219392ef;
          auVar211._0_8_ = 0x219392ef219392ef;
          auVar211._12_4_ = 0x219392ef;
          auVar211._16_4_ = 0x219392ef;
          auVar211._20_4_ = 0x219392ef;
          auVar211._24_4_ = 0x219392ef;
          auVar211._28_4_ = 0x219392ef;
          auVar186 = vcmpps_avx(auVar186,auVar211,5);
          auVar186 = vandps_avx(auVar186,auVar157);
          auVar90._4_4_ = auVar186._4_4_ * local_1100._4_4_;
          auVar90._0_4_ = auVar186._0_4_ * (float)local_1100;
          auVar90._8_4_ = auVar186._8_4_ * (float)uStack_10f8;
          auVar90._12_4_ = auVar186._12_4_ * uStack_10f8._4_4_;
          auVar90._16_4_ = auVar186._16_4_ * (float)uStack_10f0;
          auVar90._20_4_ = auVar186._20_4_ * uStack_10f0._4_4_;
          auVar90._24_4_ = auVar186._24_4_ * (float)uStack_10e8;
          auVar90._28_4_ = auVar157._28_4_;
          auVar180 = vminps_avx(auVar90,auVar223);
          auVar91._4_4_ = auVar186._4_4_ * local_1120._4_4_;
          auVar91._0_4_ = auVar186._0_4_ * (float)local_1120;
          auVar91._8_4_ = auVar186._8_4_ * (float)uStack_1118;
          auVar91._12_4_ = auVar186._12_4_ * uStack_1118._4_4_;
          auVar91._16_4_ = auVar186._16_4_ * (float)uStack_1110;
          auVar91._20_4_ = auVar186._20_4_ * uStack_1110._4_4_;
          auVar91._24_4_ = auVar186._24_4_ * (float)uStack_1108;
          auVar91._28_4_ = auVar186._28_4_;
          auVar181 = vminps_avx(auVar91,auVar223);
          uVar100 = *(undefined4 *)(local_1930 + local_18f0);
          auVar215._4_4_ = uVar100;
          auVar215._0_4_ = uVar100;
          auVar215._8_4_ = uVar100;
          auVar215._12_4_ = uVar100;
          uVar100 = *(undefined4 *)(local_1930 + local_18f0 + 4);
          auVar150._4_4_ = uVar100;
          auVar150._0_4_ = uVar100;
          auVar150._8_4_ = uVar100;
          auVar150._12_4_ = uVar100;
          auVar186 = vandps_avx(ZEXT1632(auVar215),local_13c0);
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar178 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar178 = vshufps_avx(auVar178,auVar178,0);
          auVar219._0_16_ = vpsrld_avx(auVar215,0x10);
          auVar219._16_16_ = auVar219._0_16_;
          auVar118 = vcvtdq2ps_avx(auVar219);
          auVar186 = vsubps_avx(auVar223,auVar180);
          auVar263 = vsubps_avx(auVar186,auVar181);
          auVar186 = vandps_avx(ZEXT1632(auVar150),local_13c0);
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar201 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar201 = vshufps_avx(auVar201,auVar201,0);
          auVar212._0_16_ = vpsrld_avx(auVar150,0x10);
          auVar212._16_16_ = auVar212._0_16_;
          auVar179 = vcvtdq2ps_avx(auVar212);
          uVar100 = *(undefined4 *)(local_1930 + local_18f8);
          auVar204._4_4_ = uVar100;
          auVar204._0_4_ = uVar100;
          auVar204._8_4_ = uVar100;
          auVar204._12_4_ = uVar100;
          auVar186 = vandps_avx(ZEXT1632(auVar204),local_13c0);
          auVar186 = vcvtdq2ps_avx(auVar186);
          auVar216 = ZEXT416((uint)(auVar186._0_4_ * 0.00012207031));
          auVar216 = vshufps_avx(auVar216,auVar216,0);
          local_1320._0_4_ =
               auVar180._0_4_ * auVar216._0_4_ +
               auVar263._0_4_ * auVar178._0_4_ + auVar181._0_4_ * auVar201._0_4_;
          local_1320._4_4_ =
               auVar180._4_4_ * auVar216._4_4_ +
               auVar263._4_4_ * auVar178._4_4_ + auVar181._4_4_ * auVar201._4_4_;
          fStack_1318 = auVar180._8_4_ * auVar216._8_4_ +
                        auVar263._8_4_ * auVar178._8_4_ + auVar181._8_4_ * auVar201._8_4_;
          fStack_1314 = auVar180._12_4_ * auVar216._12_4_ +
                        auVar263._12_4_ * auVar178._12_4_ + auVar181._12_4_ * auVar201._12_4_;
          fStack_1310 = auVar180._16_4_ * auVar216._0_4_ +
                        auVar263._16_4_ * auVar178._0_4_ + auVar181._16_4_ * auVar201._0_4_;
          fStack_130c = auVar180._20_4_ * auVar216._4_4_ +
                        auVar263._20_4_ * auVar178._4_4_ + auVar181._20_4_ * auVar201._4_4_;
          fStack_1308 = auVar180._24_4_ * auVar216._8_4_ +
                        auVar263._24_4_ * auVar178._8_4_ + auVar181._24_4_ * auVar201._8_4_;
          fStack_1304 = auVar216._12_4_ + auVar180._28_4_ + auVar201._12_4_;
          auVar213._0_16_ = vpsrld_avx(auVar204,0x10);
          auVar213._16_16_ = auVar213._0_16_;
          auVar186 = vcvtdq2ps_avx(auVar213);
          pRVar8 = context->user;
          local_1380 = local_1180._0_8_;
          uStack_1378 = local_1180._8_8_;
          uStack_1370 = local_1180._16_8_;
          uStack_1368 = local_1180._24_8_;
          local_1360 = local_11a0._0_8_;
          uStack_1358 = local_11a0._8_8_;
          uStack_1350 = local_11a0._16_8_;
          uStack_1348 = local_11a0._24_8_;
          local_1340 = local_11c0._0_8_;
          uStack_1338 = local_11c0._8_8_;
          uStack_1330 = local_11c0._16_8_;
          uStack_1328 = local_11c0._24_8_;
          local_12b0 = vpshufd_avx(ZEXT416(*(uint *)(local_1930 + 0x18)),0);
          local_1300 = auVar180._0_4_ * auVar186._0_4_ * 0.00012207031 +
                       auVar263._0_4_ * auVar118._0_4_ * 0.00012207031 +
                       auVar181._0_4_ * auVar179._0_4_ * 0.00012207031;
          fStack_12fc = auVar180._4_4_ * auVar186._4_4_ * 0.00012207031 +
                        auVar263._4_4_ * auVar118._4_4_ * 0.00012207031 +
                        auVar181._4_4_ * auVar179._4_4_ * 0.00012207031;
          fStack_12f8 = auVar180._8_4_ * auVar186._8_4_ * 0.00012207031 +
                        auVar263._8_4_ * auVar118._8_4_ * 0.00012207031 +
                        auVar181._8_4_ * auVar179._8_4_ * 0.00012207031;
          fStack_12f4 = auVar180._12_4_ * auVar186._12_4_ * 0.00012207031 +
                        auVar263._12_4_ * auVar118._12_4_ * 0.00012207031 +
                        auVar181._12_4_ * auVar179._12_4_ * 0.00012207031;
          fStack_12f0 = auVar180._16_4_ * auVar186._16_4_ * 0.00012207031 +
                        auVar263._16_4_ * auVar118._16_4_ * 0.00012207031 +
                        auVar181._16_4_ * auVar179._16_4_ * 0.00012207031;
          fStack_12ec = auVar180._20_4_ * auVar186._20_4_ * 0.00012207031 +
                        auVar263._20_4_ * auVar118._20_4_ * 0.00012207031 +
                        auVar181._20_4_ * auVar179._20_4_ * 0.00012207031;
          fStack_12e8 = auVar180._24_4_ * auVar186._24_4_ * 0.00012207031 +
                        auVar263._24_4_ * auVar118._24_4_ * 0.00012207031 +
                        auVar181._24_4_ * auVar179._24_4_ * 0.00012207031;
          fStack_12e4 = auVar180._28_4_ + auVar181._28_4_ + 0.0;
          local_12d0 = vpshufd_avx(ZEXT416(*(uint *)(local_1930 + 0x1c)),0);
          local_12e0 = local_12d0;
          local_12c0 = local_12b0;
          auVar186 = vcmpps_avx(ZEXT1632(local_12d0),ZEXT1632(local_12d0),0xf);
          local_1810[1] = auVar186;
          *local_1810 = auVar186;
          local_12a0 = pRVar8->instID[0];
          uStack_129c = local_12a0;
          uStack_1298 = local_12a0;
          uStack_1294 = local_12a0;
          uStack_1290 = local_12a0;
          uStack_128c = local_12a0;
          uStack_1288 = local_12a0;
          uStack_1284 = local_12a0;
          local_1280 = pRVar8->instPrimID[0];
          uStack_127c = local_1280;
          uStack_1278 = local_1280;
          uStack_1274 = local_1280;
          uStack_1270 = local_1280;
          uStack_126c = local_1280;
          uStack_1268 = local_1280;
          uStack_1264 = local_1280;
          auVar186 = *(undefined1 (*) [32])(ray + 0x100);
          auVar118 = vblendvps_avx(auVar186,local_1160,local_1840._0_32_);
          *(undefined1 (*) [32])(ray + 0x100) = auVar118;
          local_17f0.valid = (int *)local_1840;
          local_17f0.geometryUserPtr = pGVar7->userPtr;
          local_17f0.context = context->user;
          local_17f0.hit = (RTCHitN *)&local_1380;
          local_17f0.N = 8;
          local_17f0.ray = (RTCRayN *)ray;
          _local_1740 = auVar288;
          local_15c0 = auVar248;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar7->occlusionFilterN)(&local_17f0);
            auVar319 = ZEXT3264(local_17c0);
            auVar315 = ZEXT3264(local_17a0);
            auVar308 = ZEXT3264(local_1780);
            auVar305 = ZEXT3264(local_1760);
          }
          auVar178 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._0_16_);
          auVar201 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._16_16_);
          auVar128._16_16_ = auVar201;
          auVar128._0_16_ = auVar178;
          auVar118 = vcmpps_avx(ZEXT1632(auVar201),ZEXT1632(auVar201),0xf);
          auVar179 = auVar118 & ~auVar128;
          if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar179 >> 0x7f,0) == '\0') &&
                (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar179 >> 0xbf,0) == '\0') &&
              (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar179[0x1f]) {
            local_1840._0_4_ = auVar178._0_4_ ^ auVar118._0_4_;
            local_1840._4_4_ = auVar178._4_4_ ^ auVar118._4_4_;
            local_1840._8_4_ = auVar178._8_4_ ^ auVar118._8_4_;
            local_1840._12_4_ = auVar178._12_4_ ^ auVar118._12_4_;
            local_1840._16_4_ = auVar201._0_4_ ^ auVar118._16_4_;
            local_1840._20_4_ = auVar201._4_4_ ^ auVar118._20_4_;
            local_1840._24_4_ = auVar201._8_4_ ^ auVar118._24_4_;
            local_1840._28_4_ = auVar201._12_4_ ^ auVar118._28_4_;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_17f0);
              auVar319 = ZEXT3264(local_17c0);
              auVar315 = ZEXT3264(local_17a0);
              auVar308 = ZEXT3264(local_1780);
              auVar305 = ZEXT3264(local_1760);
            }
            auVar178 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._0_16_);
            auVar201 = vpcmpeqd_avx(ZEXT816(0) << 0x40,local_1840._16_16_);
            auVar159._16_16_ = auVar201;
            auVar159._0_16_ = auVar178;
            local_1840._0_8_ = auVar178._0_8_ ^ 0xffffffffffffffff;
            local_1840._8_4_ = auVar178._8_4_ ^ 0xffffffff;
            local_1840._12_4_ = auVar178._12_4_ ^ 0xffffffff;
            local_1840._16_4_ = auVar201._0_4_ ^ 0xffffffff;
            local_1840._20_4_ = auVar201._4_4_ ^ 0xffffffff;
            local_1840._24_4_ = auVar201._8_4_ ^ 0xffffffff;
            local_1840._28_4_ = auVar201._12_4_ ^ 0xffffffff;
            auVar188._8_4_ = 0xff800000;
            auVar188._0_8_ = 0xff800000ff800000;
            auVar188._12_4_ = 0xff800000;
            auVar188._16_4_ = 0xff800000;
            auVar188._20_4_ = 0xff800000;
            auVar188._24_4_ = 0xff800000;
            auVar188._28_4_ = 0xff800000;
            auVar118 = vblendvps_avx(auVar188,*(undefined1 (*) [32])(local_17f0.ray + 0x100),
                                     auVar159);
            *(undefined1 (*) [32])(local_17f0.ray + 0x100) = auVar118;
          }
          auVar186 = vblendvps_avx(auVar186,*(undefined1 (*) [32])pRVar2,local_1840._0_32_);
          *(undefined1 (*) [32])pRVar2 = auVar186;
          pRVar99 = pRVar2;
        }
        local_1860 = vandnps_avx(local_1840._0_32_,local_1860);
      }
      if (((((((((local_1860 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (local_1860 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (local_1860 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(local_1860 >> 0x7f,0) == '\0') &&
             (local_1860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(local_1860 >> 0xbf,0) == '\0') &&
           (local_1860 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           -1 < local_1860[0x1f]) || ((int)local_16b0 == 2)) break;
      pRVar99 = local_16a8 + 4;
      local_18f8 = local_18f8 + 4;
      lVar114 = lVar114 + 4;
      lVar106 = lVar106 + 4;
      local_18f0 = local_18f0 + 4;
      lVar102 = local_1660 + 4;
      lVar109 = local_1640 + 4;
      local_1600 = local_1600 + 4;
      if (local_16a8 != (RayK<8> *)0x0) break;
    }
    if (iVar6 == 2) break;
  }
  auVar129._0_8_ = local_1860._0_8_ ^ 0xffffffffffffffff;
  auVar129._8_4_ = local_1860._8_4_ ^ 0xffffffff;
  auVar129._12_4_ = local_1860._12_4_ ^ 0xffffffff;
  auVar129._16_4_ = local_1860._16_4_ ^ 0xffffffff;
  auVar129._20_4_ = local_1860._20_4_ ^ 0xffffffff;
  auVar129._24_4_ = local_1860._24_4_ ^ 0xffffffff;
  auVar129._28_4_ = local_1860._28_4_ ^ 0xffffffff;
  uVar101 = 0;
LAB_003f73ff:
  auVar118 = vorps_avx(local_1220,auVar129);
  auVar279 = ZEXT3264(auVar118);
  auVar186 = vandnps_avx(auVar118,local_1620);
  auVar179 = local_1620 & ~auVar118;
  local_1620 = auVar186;
  if ((((((((auVar179 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar179 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar179 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar179 >> 0x7f,0) == '\0') &&
        (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar179 >> 0xbf,0) == '\0') &&
      (auVar179 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar179[0x1f]) {
    bVar115 = true;
  }
  else {
    auVar160._8_4_ = 0xff800000;
    auVar160._0_8_ = 0xff800000ff800000;
    auVar160._12_4_ = 0xff800000;
    auVar160._16_4_ = 0xff800000;
    auVar160._20_4_ = 0xff800000;
    auVar160._24_4_ = 0xff800000;
    auVar160._28_4_ = 0xff800000;
    local_1500 = vblendvps_avx(local_1500,auVar160,auVar118);
    if (uVar101 != 0) {
      *puVar104 = uVar101;
      uVar100 = vmovmskps_avx(auVar186);
      puVar104[1] = CONCAT44((int)((ulong)pRVar99 >> 0x20),uVar100);
      puVar104 = puVar104 + 2;
    }
    bVar115 = false;
  }
LAB_003f7451:
  if (bVar115) goto LAB_003f748e;
  goto LAB_003f5bb5;
LAB_003f748e:
  if (local_16e0 == 0) {
    auVar130._0_16_ = local_1240._0_16_;
    auVar130._16_16_ = local_14b0;
    auVar186 = vandps_avx(auVar279._0_32_,auVar130);
    auVar161._8_4_ = 0xff800000;
    auVar161._0_8_ = 0xff800000ff800000;
    auVar161._12_4_ = 0xff800000;
    auVar161._16_4_ = 0xff800000;
    auVar161._20_4_ = 0xff800000;
    auVar161._24_4_ = 0xff800000;
    auVar161._28_4_ = 0xff800000;
    auVar186 = vmaskmovps_avx(auVar186,auVar161);
    *(undefined1 (*) [32])pRVar2 = auVar186;
    return;
  }
  goto LAB_003f5753;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }